

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O1

size_t ZSTD_compressBlock_lazy2_extDict_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *puVar4;
  ulong *iEnd;
  BYTE *iStart;
  undefined8 *puVar5;
  ulong *iLimit;
  char *pcVar6;
  char *pcVar7;
  byte bVar8;
  uint uVar9;
  uint uVar10;
  BYTE *base_00;
  BYTE *pBVar11;
  U32 *pUVar12;
  U16 *pUVar13;
  seqDef *psVar14;
  int iVar15;
  ushort uVar16;
  undefined8 uVar17;
  U32 target;
  uint uVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  ulong *puVar22;
  size_t sVar23;
  ulong uVar24;
  BYTE *pBVar25;
  ulong uVar26;
  BYTE *pBVar27;
  ulong uVar28;
  U32 UVar29;
  uint uVar30;
  ulong *puVar31;
  ulong *puVar32;
  BYTE *pBVar33;
  uint uVar34;
  ulong *puVar35;
  ulong *puVar36;
  BYTE *pBVar37;
  BYTE *pBVar38;
  int iVar39;
  ulong *puVar40;
  long lVar41;
  uint uVar42;
  int iVar43;
  ulong uVar44;
  uint uVar45;
  U32 *hashTable_3;
  ulong uVar46;
  uint uVar47;
  U32 UVar48;
  BYTE *base;
  BYTE *pBVar49;
  ulong uVar50;
  bool bVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  U32 hashLog_7;
  U32 hashLog_3;
  U32 maxDistance;
  BYTE *litLimit_w;
  char local_1b0;
  char local_198;
  ulong local_178;
  BYTE *local_160;
  uint local_144;
  U32 local_12c;
  ulong *local_110;
  uint auStack_b8 [32];
  U32 *local_38;
  char cVar61;
  undefined1 uVar88;
  char cVar89;
  undefined1 uVar90;
  char cVar91;
  undefined1 uVar92;
  char cVar93;
  
  iEnd = (ulong *)((long)src + srcSize);
  iLimit = (ulong *)((long)src + (srcSize - 0x10));
  base_00 = (ms->window).base;
  pBVar11 = (ms->window).dictBase;
  uVar9 = (ms->window).dictLimit;
  iStart = base_00 + uVar9;
  uVar10 = (ms->window).lowLimit;
  puVar40 = (ulong *)((ulong)(iStart == (BYTE *)src) + (long)src);
  uVar18 = (ms->cParams).minMatch;
  UVar48 = 6;
  if (uVar18 < 6) {
    UVar48 = uVar18;
  }
  uVar18 = (ms->cParams).windowLog;
  local_144 = *rep;
  local_12c = rep[1];
  local_38 = rep;
  ZSTD_row_fillHashCache
            (ms,base_00,5 - ((ms->cParams).searchLog < 5),UVar48,ms->nextToUpdate,(BYTE *)iLimit);
  local_110 = (ulong *)src;
  if (puVar40 < iLimit) {
    puVar22 = (ulong *)(pBVar11 + uVar9);
    uVar18 = 1 << ((byte)uVar18 & 0x1f);
    iVar19 = uVar9 - 1;
    puVar1 = (ulong *)((long)iEnd - 7);
    puVar2 = (ulong *)((long)iEnd - 3);
    puVar3 = (ulong *)((long)iEnd - 1);
    puVar4 = iEnd + -4;
    do {
      iVar39 = (int)puVar40 - (int)base_00;
      iVar20 = iVar39 + 1;
      uVar47 = (ms->window).lowLimit;
      UVar48 = ms->loadedDictEnd;
      uVar30 = iVar20 - uVar18;
      if (iVar20 - uVar47 <= uVar18) {
        uVar30 = uVar47;
      }
      if (UVar48 != 0) {
        uVar30 = uVar47;
      }
      uVar21 = iVar20 - local_144;
      pBVar33 = base_00;
      if (uVar21 < uVar9) {
        pBVar33 = pBVar11;
      }
      if (iVar19 - uVar21 < 3) {
        pBVar49 = (BYTE *)0x0;
      }
      else {
        pBVar49 = (BYTE *)0x0;
        if (local_144 < (iVar39 - uVar30) + 1) {
          if (*(int *)((long)puVar40 + 1U) == *(int *)(pBVar33 + uVar21)) {
            puVar31 = iEnd;
            if (uVar21 < uVar9) {
              puVar31 = puVar22;
            }
            sVar23 = ZSTD_count_2segments
                               ((BYTE *)((long)puVar40 + 5),(BYTE *)((long)(pBVar33 + uVar21) + 4),
                                (BYTE *)iEnd,(BYTE *)puVar31,iStart);
            pBVar49 = (BYTE *)(sVar23 + 4);
          }
          else {
            pBVar49 = (BYTE *)0x0;
          }
        }
      }
      uVar30 = (ms->cParams).searchLog;
      uVar21 = (ms->cParams).minMatch;
      if (uVar30 < 5) {
        if (uVar21 - 6 < 2) {
          pBVar33 = (ms->window).base;
          pBVar37 = (ms->window).dictBase;
          uVar21 = (ms->window).dictLimit;
          uVar24 = (long)puVar40 - (long)pBVar33;
          uVar42 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
          uVar34 = (uint)uVar24;
          uVar45 = uVar34 - uVar42;
          if (uVar34 - uVar47 <= uVar42) {
            uVar45 = uVar47;
          }
          pUVar12 = ms->hashTable;
          if (UVar48 != 0) {
            uVar45 = uVar47;
          }
          if (3 < uVar30) {
            uVar30 = 4;
          }
          iVar20 = 1 << ((byte)uVar30 & 0x1f);
          pUVar13 = ms->tagTable;
          uVar46 = (ulong)ms->nextToUpdate;
          cVar61 = (char)ms->rowHashLog;
          if (ms->nextToUpdate < uVar34) {
            do {
              uVar30 = (uint)uVar46 & 7;
              uVar47 = ms->hashCache[uVar30];
              ms->hashCache[uVar30] =
                   (U32)((ulong)(*(long *)(pBVar33 + uVar46 + 8) * -0x30e4432340650000) >>
                        (0x38U - cVar61 & 0x3f));
              uVar50 = (ulong)(uVar47 >> 4 & 0xfffffff0);
              uVar30 = (byte)((char)pUVar13[uVar50] - 1) & 0xf;
              *(char *)(pUVar13 + uVar50) = (char)uVar30;
              *(char *)((long)pUVar13 + (ulong)uVar30 + 1 + uVar50 * 2) = (char)uVar47;
              pUVar12[uVar50 + uVar30] = (uint)uVar46;
              uVar46 = uVar46 + 1;
            } while (uVar46 < (uVar24 & 0xffffffff));
          }
          ms->nextToUpdate = uVar34;
          uVar47 = ms->hashCache[uVar34 & 7];
          ms->hashCache[uVar34 & 7] =
               (U32)((ulong)(*(long *)(pBVar33 + (uVar24 & 0xffffffff) + 8) * -0x30e4432340650000)
                    >> (0x38U - cVar61 & 0x3f));
          uVar24 = (ulong)(uVar47 >> 4 & 0xfffffff0);
          bVar8 = (byte)pUVar13[uVar24];
          pcVar6 = (char *)((long)pUVar13 + uVar24 * 2 + 1);
          uVar92 = (undefined1)(uVar47 >> 0x18);
          uVar90 = (undefined1)(uVar47 >> 0x10);
          uVar88 = (undefined1)(uVar47 >> 8);
          auVar63._4_4_ =
               (int)(CONCAT35(CONCAT21(CONCAT11(uVar92,uVar92),uVar90),CONCAT14(uVar90,uVar47)) >>
                    0x20);
          auVar63[3] = uVar88;
          auVar63[2] = uVar88;
          auVar63[0] = (undefined1)uVar47;
          auVar63[1] = auVar63[0];
          auVar63._8_8_ = 0;
          auVar95 = pshuflw(auVar63,auVar63,0);
          cVar61 = auVar95[0];
          auVar64[0] = -(cVar61 == *pcVar6);
          cVar89 = auVar95[1];
          auVar64[1] = -(cVar89 == pcVar6[1]);
          cVar91 = auVar95[2];
          auVar64[2] = -(cVar91 == pcVar6[2]);
          cVar93 = auVar95[3];
          auVar64[3] = -(cVar93 == pcVar6[3]);
          auVar64[4] = -(cVar61 == pcVar6[4]);
          auVar64[5] = -(cVar89 == pcVar6[5]);
          auVar64[6] = -(cVar91 == pcVar6[6]);
          auVar64[7] = -(cVar93 == pcVar6[7]);
          auVar64[8] = -(cVar61 == pcVar6[8]);
          auVar64[9] = -(cVar89 == pcVar6[9]);
          auVar64[10] = -(cVar91 == pcVar6[10]);
          auVar64[0xb] = -(cVar93 == pcVar6[0xb]);
          auVar64[0xc] = -(cVar61 == pcVar6[0xc]);
          auVar64[0xd] = -(cVar89 == pcVar6[0xd]);
          auVar64[0xe] = -(cVar91 == pcVar6[0xe]);
          auVar64[0xf] = -(cVar93 == pcVar6[0xf]);
          uVar16 = (ushort)(SUB161(auVar64 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar64 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar64 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar64 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar64 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar64 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar64 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar64 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar64 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar64 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar64 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar64 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar64 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar64 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar64 >> 0x77,0) & 1) << 0xe |
                   (ushort)(auVar64[0xf] >> 7) << 0xf;
          uVar47 = (uint)uVar16;
          if ((bVar8 & 0xf) != 0) {
            uVar47 = (uint)uVar16 << (0x10 - (bVar8 & 0xf) & 0x1f) & 0xfffe |
                     (uint)(uVar16 >> (bVar8 & 0xf));
          }
          if (uVar47 == 0) {
            uVar46 = 0;
          }
          else {
            uVar46 = 0;
            while( true ) {
              iVar20 = iVar20 + -1;
              iVar43 = 0;
              if (uVar47 != 0) {
                for (; (uVar47 >> iVar43 & 1) == 0; iVar43 = iVar43 + 1) {
                }
              }
              if (pUVar12[uVar24 + (iVar43 + (uint)bVar8 & 0xf)] < uVar45) break;
              auStack_b8[uVar46] = pUVar12[uVar24 + (iVar43 + (uint)bVar8 & 0xf)];
              uVar46 = uVar46 + 1;
              uVar47 = uVar47 & uVar47 - 1;
              if ((uVar47 == 0) || (iVar20 == 0)) break;
            }
          }
          uVar47 = bVar8 - 1 & 0xf;
          *(char *)(pUVar13 + uVar24) = (char)uVar47;
          *(undefined1 *)((long)(pUVar13 + uVar24) + (ulong)uVar47 + 1) = auVar63[0];
          UVar48 = ms->nextToUpdate;
          ms->nextToUpdate = UVar48 + 1;
          pUVar12[uVar24 + uVar47] = UVar48;
          if (uVar46 == 0) goto LAB_006f0521;
          local_178 = 999999999;
          uVar24 = 0;
          pBVar27 = (BYTE *)0x3;
          do {
            uVar47 = auStack_b8[uVar24];
            if (uVar47 < uVar21) {
              if (*(int *)(pBVar37 + uVar47) == (int)*puVar40) {
                sVar23 = ZSTD_count_2segments
                                   ((BYTE *)((long)puVar40 + 4),pBVar37 + (ulong)uVar47 + 4,
                                    (BYTE *)iEnd,pBVar37 + uVar21,pBVar33 + uVar21);
                pBVar25 = (BYTE *)(sVar23 + 4);
              }
              else {
LAB_006efd51:
                pBVar25 = (BYTE *)0x0;
              }
            }
            else {
              puVar31 = (ulong *)(pBVar33 + uVar47);
              if (pBVar27[(long)puVar31] != *(BYTE *)((long)puVar40 + (long)pBVar27))
              goto LAB_006efd51;
              puVar35 = puVar40;
              if (puVar40 < puVar1) {
                uVar26 = *puVar40 ^ *puVar31;
                uVar50 = 0;
                if (uVar26 != 0) {
                  for (; (uVar26 >> uVar50 & 1) == 0; uVar50 = uVar50 + 1) {
                  }
                }
                pBVar25 = (BYTE *)(uVar50 >> 3 & 0x1fffffff);
                if (*puVar31 == *puVar40) {
                  do {
                    puVar35 = puVar35 + 1;
                    puVar31 = puVar31 + 1;
                    if (puVar1 <= puVar35) goto LAB_006efd58;
                    uVar26 = *puVar35 ^ *puVar31;
                    uVar50 = 0;
                    if (uVar26 != 0) {
                      for (; (uVar26 >> uVar50 & 1) == 0; uVar50 = uVar50 + 1) {
                      }
                    }
                    pBVar25 = (BYTE *)((long)puVar35 + ((uVar50 >> 3 & 0x1fffffff) - (long)puVar40))
                    ;
                  } while (*puVar31 == *puVar35);
                }
              }
              else {
LAB_006efd58:
                if ((puVar35 < puVar2) && ((int)*puVar31 == (int)*puVar35)) {
                  puVar35 = (ulong *)((long)puVar35 + 4);
                  puVar31 = (ulong *)((long)puVar31 + 4);
                }
                if ((puVar35 < puVar3) && ((short)*puVar31 == (short)*puVar35)) {
                  puVar35 = (ulong *)((long)puVar35 + 2);
                  puVar31 = (ulong *)((long)puVar31 + 2);
                }
                if (puVar35 < iEnd) {
                  puVar35 = (ulong *)((long)puVar35 + (ulong)((BYTE)*puVar31 == (BYTE)*puVar35));
                }
                pBVar25 = (BYTE *)((long)puVar35 - (long)puVar40);
              }
            }
            pBVar38 = pBVar27;
            if (pBVar27 < pBVar25) {
              pBVar38 = pBVar25;
              local_178 = (ulong)((uVar34 + 2) - uVar47);
            }
          } while ((pBVar25 <= pBVar27 || (ulong *)((long)puVar40 + (long)pBVar25) != iEnd) &&
                  (uVar24 = uVar24 + 1, pBVar27 = pBVar38, uVar24 < uVar46));
        }
        else if (uVar21 == 5) {
          pBVar33 = (ms->window).base;
          pBVar37 = (ms->window).dictBase;
          uVar21 = (ms->window).dictLimit;
          uVar24 = (long)puVar40 - (long)pBVar33;
          uVar42 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
          uVar34 = (uint)uVar24;
          uVar45 = uVar34 - uVar42;
          if (uVar34 - uVar47 <= uVar42) {
            uVar45 = uVar47;
          }
          pUVar12 = ms->hashTable;
          if (UVar48 != 0) {
            uVar45 = uVar47;
          }
          if (3 < uVar30) {
            uVar30 = 4;
          }
          iVar20 = 1 << ((byte)uVar30 & 0x1f);
          pUVar13 = ms->tagTable;
          uVar46 = (ulong)ms->nextToUpdate;
          cVar61 = (char)ms->rowHashLog;
          if (ms->nextToUpdate < uVar34) {
            do {
              uVar30 = (uint)uVar46 & 7;
              uVar47 = ms->hashCache[uVar30];
              ms->hashCache[uVar30] =
                   (U32)((ulong)(*(long *)(pBVar33 + uVar46 + 8) * -0x30e4432345000000) >>
                        (0x38U - cVar61 & 0x3f));
              uVar50 = (ulong)(uVar47 >> 4 & 0xfffffff0);
              uVar30 = (byte)((char)pUVar13[uVar50] - 1) & 0xf;
              *(char *)(pUVar13 + uVar50) = (char)uVar30;
              *(char *)((long)pUVar13 + (ulong)uVar30 + 1 + uVar50 * 2) = (char)uVar47;
              pUVar12[uVar50 + uVar30] = (uint)uVar46;
              uVar46 = uVar46 + 1;
            } while (uVar46 < (uVar24 & 0xffffffff));
          }
          ms->nextToUpdate = uVar34;
          uVar47 = ms->hashCache[uVar34 & 7];
          ms->hashCache[uVar34 & 7] =
               (U32)((ulong)(*(long *)(pBVar33 + (uVar24 & 0xffffffff) + 8) * -0x30e4432345000000)
                    >> (0x38U - cVar61 & 0x3f));
          uVar24 = (ulong)(uVar47 >> 4 & 0xfffffff0);
          bVar8 = (byte)pUVar13[uVar24];
          pcVar6 = (char *)((long)pUVar13 + uVar24 * 2 + 1);
          uVar92 = (undefined1)(uVar47 >> 0x18);
          uVar90 = (undefined1)(uVar47 >> 0x10);
          uVar88 = (undefined1)(uVar47 >> 8);
          auVar68._4_4_ =
               (int)(CONCAT35(CONCAT21(CONCAT11(uVar92,uVar92),uVar90),CONCAT14(uVar90,uVar47)) >>
                    0x20);
          auVar68[3] = uVar88;
          auVar68[2] = uVar88;
          auVar68[0] = (undefined1)uVar47;
          auVar68[1] = auVar68[0];
          auVar68._8_8_ = 0;
          auVar95 = pshuflw(auVar68,auVar68,0);
          cVar61 = auVar95[0];
          auVar66[0] = -(cVar61 == *pcVar6);
          cVar89 = auVar95[1];
          auVar66[1] = -(cVar89 == pcVar6[1]);
          cVar91 = auVar95[2];
          auVar66[2] = -(cVar91 == pcVar6[2]);
          cVar93 = auVar95[3];
          auVar66[3] = -(cVar93 == pcVar6[3]);
          auVar66[4] = -(cVar61 == pcVar6[4]);
          auVar66[5] = -(cVar89 == pcVar6[5]);
          auVar66[6] = -(cVar91 == pcVar6[6]);
          auVar66[7] = -(cVar93 == pcVar6[7]);
          auVar66[8] = -(cVar61 == pcVar6[8]);
          auVar66[9] = -(cVar89 == pcVar6[9]);
          auVar66[10] = -(cVar91 == pcVar6[10]);
          auVar66[0xb] = -(cVar93 == pcVar6[0xb]);
          auVar66[0xc] = -(cVar61 == pcVar6[0xc]);
          auVar66[0xd] = -(cVar89 == pcVar6[0xd]);
          auVar66[0xe] = -(cVar91 == pcVar6[0xe]);
          auVar66[0xf] = -(cVar93 == pcVar6[0xf]);
          uVar16 = (ushort)(SUB161(auVar66 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar66 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar66 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar66 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar66 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar66 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar66 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar66 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar66 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar66 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar66 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar66 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar66 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar66 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar66 >> 0x77,0) & 1) << 0xe |
                   (ushort)(auVar66[0xf] >> 7) << 0xf;
          uVar47 = (uint)uVar16;
          if ((bVar8 & 0xf) != 0) {
            uVar47 = (uint)uVar16 << (0x10 - (bVar8 & 0xf) & 0x1f) & 0xfffe |
                     (uint)(uVar16 >> (bVar8 & 0xf));
          }
          if (uVar47 == 0) {
            uVar46 = 0;
          }
          else {
            uVar46 = 0;
            while( true ) {
              iVar20 = iVar20 + -1;
              iVar43 = 0;
              if (uVar47 != 0) {
                for (; (uVar47 >> iVar43 & 1) == 0; iVar43 = iVar43 + 1) {
                }
              }
              if (pUVar12[uVar24 + (iVar43 + (uint)bVar8 & 0xf)] < uVar45) break;
              auStack_b8[uVar46] = pUVar12[uVar24 + (iVar43 + (uint)bVar8 & 0xf)];
              uVar46 = uVar46 + 1;
              uVar47 = uVar47 & uVar47 - 1;
              if ((uVar47 == 0) || (iVar20 == 0)) break;
            }
          }
          uVar47 = bVar8 - 1 & 0xf;
          *(char *)(pUVar13 + uVar24) = (char)uVar47;
          *(undefined1 *)((long)(pUVar13 + uVar24) + (ulong)uVar47 + 1) = auVar68[0];
          UVar48 = ms->nextToUpdate;
          ms->nextToUpdate = UVar48 + 1;
          pUVar12[uVar24 + uVar47] = UVar48;
          if (uVar46 == 0) goto LAB_006f0521;
          local_178 = 999999999;
          uVar24 = 0;
          pBVar27 = (BYTE *)0x3;
          do {
            uVar47 = auStack_b8[uVar24];
            if (uVar47 < uVar21) {
              if (*(int *)(pBVar37 + uVar47) == (int)*puVar40) {
                sVar23 = ZSTD_count_2segments
                                   ((BYTE *)((long)puVar40 + 4),pBVar37 + (ulong)uVar47 + 4,
                                    (BYTE *)iEnd,pBVar37 + uVar21,pBVar33 + uVar21);
                pBVar25 = (BYTE *)(sVar23 + 4);
              }
              else {
LAB_006f00f9:
                pBVar25 = (BYTE *)0x0;
              }
            }
            else {
              puVar31 = (ulong *)(pBVar33 + uVar47);
              if (pBVar27[(long)puVar31] != *(BYTE *)((long)puVar40 + (long)pBVar27))
              goto LAB_006f00f9;
              puVar35 = puVar40;
              if (puVar40 < puVar1) {
                uVar26 = *puVar40 ^ *puVar31;
                uVar50 = 0;
                if (uVar26 != 0) {
                  for (; (uVar26 >> uVar50 & 1) == 0; uVar50 = uVar50 + 1) {
                  }
                }
                pBVar25 = (BYTE *)(uVar50 >> 3 & 0x1fffffff);
                if (*puVar31 == *puVar40) {
                  do {
                    puVar35 = puVar35 + 1;
                    puVar31 = puVar31 + 1;
                    if (puVar1 <= puVar35) goto LAB_006f0100;
                    uVar26 = *puVar35 ^ *puVar31;
                    uVar50 = 0;
                    if (uVar26 != 0) {
                      for (; (uVar26 >> uVar50 & 1) == 0; uVar50 = uVar50 + 1) {
                      }
                    }
                    pBVar25 = (BYTE *)((long)puVar35 + ((uVar50 >> 3 & 0x1fffffff) - (long)puVar40))
                    ;
                  } while (*puVar31 == *puVar35);
                }
              }
              else {
LAB_006f0100:
                if ((puVar35 < puVar2) && ((int)*puVar31 == (int)*puVar35)) {
                  puVar35 = (ulong *)((long)puVar35 + 4);
                  puVar31 = (ulong *)((long)puVar31 + 4);
                }
                if ((puVar35 < puVar3) && ((short)*puVar31 == (short)*puVar35)) {
                  puVar35 = (ulong *)((long)puVar35 + 2);
                  puVar31 = (ulong *)((long)puVar31 + 2);
                }
                if (puVar35 < iEnd) {
                  puVar35 = (ulong *)((long)puVar35 + (ulong)((BYTE)*puVar31 == (BYTE)*puVar35));
                }
                pBVar25 = (BYTE *)((long)puVar35 - (long)puVar40);
              }
            }
            pBVar38 = pBVar27;
            if (pBVar27 < pBVar25) {
              pBVar38 = pBVar25;
              local_178 = (ulong)((uVar34 + 2) - uVar47);
            }
          } while ((pBVar25 <= pBVar27 || (ulong *)((long)puVar40 + (long)pBVar25) != iEnd) &&
                  (uVar24 = uVar24 + 1, pBVar27 = pBVar38, uVar24 < uVar46));
        }
        else {
          pBVar33 = (ms->window).base;
          pBVar37 = (ms->window).dictBase;
          uVar21 = (ms->window).dictLimit;
          uVar24 = (long)puVar40 - (long)pBVar33;
          uVar42 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
          uVar34 = (uint)uVar24;
          uVar45 = uVar34 - uVar42;
          if (uVar34 - uVar47 <= uVar42) {
            uVar45 = uVar47;
          }
          pUVar12 = ms->hashTable;
          if (UVar48 != 0) {
            uVar45 = uVar47;
          }
          if (3 < uVar30) {
            uVar30 = 4;
          }
          iVar20 = 1 << ((byte)uVar30 & 0x1f);
          pUVar13 = ms->tagTable;
          uVar46 = (ulong)ms->nextToUpdate;
          cVar61 = (char)ms->rowHashLog;
          if (ms->nextToUpdate < uVar34) {
            do {
              uVar30 = (uint)uVar46 & 7;
              uVar47 = ms->hashCache[uVar30];
              ms->hashCache[uVar30] =
                   (uint)(*(int *)(pBVar33 + uVar46 + 8) * -0x61c8864f) >> (0x18U - cVar61 & 0x1f);
              uVar50 = (ulong)(uVar47 >> 4 & 0xfffffff0);
              uVar30 = (byte)((char)pUVar13[uVar50] - 1) & 0xf;
              *(char *)(pUVar13 + uVar50) = (char)uVar30;
              *(char *)((long)pUVar13 + (ulong)uVar30 + 1 + uVar50 * 2) = (char)uVar47;
              pUVar12[uVar50 + uVar30] = (uint)uVar46;
              uVar46 = uVar46 + 1;
            } while (uVar46 < (uVar24 & 0xffffffff));
          }
          ms->nextToUpdate = uVar34;
          uVar47 = ms->hashCache[uVar34 & 7];
          ms->hashCache[uVar34 & 7] =
               (uint)(*(int *)(pBVar33 + (uVar24 & 0xffffffff) + 8) * -0x61c8864f) >>
               (0x18U - cVar61 & 0x1f);
          uVar24 = (ulong)(uVar47 >> 4 & 0xfffffff0);
          bVar8 = (byte)pUVar13[uVar24];
          pcVar6 = (char *)((long)pUVar13 + uVar24 * 2 + 1);
          uVar92 = (undefined1)(uVar47 >> 0x18);
          uVar90 = (undefined1)(uVar47 >> 0x10);
          uVar88 = (undefined1)(uVar47 >> 8);
          auVar95._4_4_ =
               (int)(CONCAT35(CONCAT21(CONCAT11(uVar92,uVar92),uVar90),CONCAT14(uVar90,uVar47)) >>
                    0x20);
          auVar95[3] = uVar88;
          auVar95[2] = uVar88;
          auVar95[0] = (undefined1)uVar47;
          auVar95[1] = auVar95[0];
          auVar95._8_8_ = 0;
          auVar68 = pshuflw(auVar95,auVar95,0);
          cVar61 = auVar68[0];
          auVar69[0] = -(cVar61 == *pcVar6);
          cVar89 = auVar68[1];
          auVar69[1] = -(cVar89 == pcVar6[1]);
          cVar91 = auVar68[2];
          auVar69[2] = -(cVar91 == pcVar6[2]);
          cVar93 = auVar68[3];
          auVar69[3] = -(cVar93 == pcVar6[3]);
          auVar69[4] = -(cVar61 == pcVar6[4]);
          auVar69[5] = -(cVar89 == pcVar6[5]);
          auVar69[6] = -(cVar91 == pcVar6[6]);
          auVar69[7] = -(cVar93 == pcVar6[7]);
          auVar69[8] = -(cVar61 == pcVar6[8]);
          auVar69[9] = -(cVar89 == pcVar6[9]);
          auVar69[10] = -(cVar91 == pcVar6[10]);
          auVar69[0xb] = -(cVar93 == pcVar6[0xb]);
          auVar69[0xc] = -(cVar61 == pcVar6[0xc]);
          auVar69[0xd] = -(cVar89 == pcVar6[0xd]);
          auVar69[0xe] = -(cVar91 == pcVar6[0xe]);
          auVar69[0xf] = -(cVar93 == pcVar6[0xf]);
          uVar16 = (ushort)(SUB161(auVar69 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar69 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar69 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar69 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar69 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar69 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar69 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar69 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar69 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar69 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar69 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar69 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar69 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar69 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar69 >> 0x77,0) & 1) << 0xe |
                   (ushort)(auVar69[0xf] >> 7) << 0xf;
          uVar47 = (uint)uVar16;
          if ((bVar8 & 0xf) != 0) {
            uVar47 = (uint)uVar16 << (0x10 - (bVar8 & 0xf) & 0x1f) & 0xfffe |
                     (uint)(uVar16 >> (bVar8 & 0xf));
          }
          if (uVar47 == 0) {
            uVar46 = 0;
          }
          else {
            uVar46 = 0;
            while( true ) {
              iVar20 = iVar20 + -1;
              iVar43 = 0;
              if (uVar47 != 0) {
                for (; (uVar47 >> iVar43 & 1) == 0; iVar43 = iVar43 + 1) {
                }
              }
              if (pUVar12[uVar24 + (iVar43 + (uint)bVar8 & 0xf)] < uVar45) break;
              auStack_b8[uVar46] = pUVar12[uVar24 + (iVar43 + (uint)bVar8 & 0xf)];
              uVar46 = uVar46 + 1;
              uVar47 = uVar47 & uVar47 - 1;
              if ((uVar47 == 0) || (iVar20 == 0)) break;
            }
          }
          uVar47 = bVar8 - 1 & 0xf;
          *(char *)(pUVar13 + uVar24) = (char)uVar47;
          *(undefined1 *)((long)(pUVar13 + uVar24) + (ulong)uVar47 + 1) = auVar95[0];
          UVar48 = ms->nextToUpdate;
          ms->nextToUpdate = UVar48 + 1;
          pUVar12[uVar24 + uVar47] = UVar48;
          if (uVar46 == 0) goto LAB_006f0521;
          local_178 = 999999999;
          uVar24 = 0;
          pBVar27 = (BYTE *)0x3;
          do {
            uVar47 = auStack_b8[uVar24];
            if (uVar47 < uVar21) {
              if (*(int *)(pBVar37 + uVar47) == (int)*puVar40) {
                sVar23 = ZSTD_count_2segments
                                   ((BYTE *)((long)puVar40 + 4),pBVar37 + (ulong)uVar47 + 4,
                                    (BYTE *)iEnd,pBVar37 + uVar21,pBVar33 + uVar21);
                pBVar25 = (BYTE *)(sVar23 + 4);
              }
              else {
LAB_006f04a0:
                pBVar25 = (BYTE *)0x0;
              }
            }
            else {
              puVar31 = (ulong *)(pBVar33 + uVar47);
              if (pBVar27[(long)puVar31] != *(BYTE *)((long)puVar40 + (long)pBVar27))
              goto LAB_006f04a0;
              puVar35 = puVar40;
              if (puVar40 < puVar1) {
                uVar26 = *puVar40 ^ *puVar31;
                uVar50 = 0;
                if (uVar26 != 0) {
                  for (; (uVar26 >> uVar50 & 1) == 0; uVar50 = uVar50 + 1) {
                  }
                }
                pBVar25 = (BYTE *)(uVar50 >> 3 & 0x1fffffff);
                if (*puVar31 == *puVar40) {
                  do {
                    puVar35 = puVar35 + 1;
                    puVar31 = puVar31 + 1;
                    if (puVar1 <= puVar35) goto LAB_006f04a7;
                    uVar26 = *puVar35 ^ *puVar31;
                    uVar50 = 0;
                    if (uVar26 != 0) {
                      for (; (uVar26 >> uVar50 & 1) == 0; uVar50 = uVar50 + 1) {
                      }
                    }
                    pBVar25 = (BYTE *)((long)puVar35 + ((uVar50 >> 3 & 0x1fffffff) - (long)puVar40))
                    ;
                  } while (*puVar31 == *puVar35);
                }
              }
              else {
LAB_006f04a7:
                if ((puVar35 < puVar2) && ((int)*puVar31 == (int)*puVar35)) {
                  puVar35 = (ulong *)((long)puVar35 + 4);
                  puVar31 = (ulong *)((long)puVar31 + 4);
                }
                if ((puVar35 < puVar3) && ((short)*puVar31 == (short)*puVar35)) {
                  puVar35 = (ulong *)((long)puVar35 + 2);
                  puVar31 = (ulong *)((long)puVar31 + 2);
                }
                if (puVar35 < iEnd) {
                  puVar35 = (ulong *)((long)puVar35 + (ulong)((BYTE)*puVar31 == (BYTE)*puVar35));
                }
                pBVar25 = (BYTE *)((long)puVar35 - (long)puVar40);
              }
            }
            pBVar38 = pBVar27;
            if (pBVar27 < pBVar25) {
              pBVar38 = pBVar25;
              local_178 = (ulong)((uVar34 + 2) - uVar47);
            }
          } while ((pBVar25 <= pBVar27 || (ulong *)((long)puVar40 + (long)pBVar25) != iEnd) &&
                  (uVar24 = uVar24 + 1, pBVar27 = pBVar38, uVar24 < uVar46));
        }
      }
      else if (uVar21 - 6 < 2) {
        pBVar33 = (ms->window).base;
        pBVar37 = (ms->window).dictBase;
        uVar30 = (ms->window).dictLimit;
        uVar24 = (long)puVar40 - (long)pBVar33;
        uVar34 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        uVar45 = (uint)uVar24;
        uVar21 = uVar45 - uVar34;
        if (uVar45 - uVar47 <= uVar34) {
          uVar21 = uVar47;
        }
        pUVar12 = ms->hashTable;
        pUVar13 = ms->tagTable;
        if (UVar48 != 0) {
          uVar21 = uVar47;
        }
        uVar46 = (ulong)ms->nextToUpdate;
        cVar61 = (char)ms->rowHashLog;
        if (ms->nextToUpdate < uVar45) {
          do {
            uVar34 = (uint)uVar46 & 7;
            uVar47 = ms->hashCache[uVar34];
            ms->hashCache[uVar34] =
                 (U32)((ulong)(*(long *)(pBVar33 + uVar46 + 8) * -0x30e4432340650000) >>
                      (0x38U - cVar61 & 0x3f));
            uVar50 = (ulong)(uVar47 >> 3 & 0xffffffe0);
            uVar34 = (byte)((char)pUVar13[uVar50] - 1) & 0x1f;
            *(char *)(pUVar13 + uVar50) = (char)uVar34;
            *(char *)((long)pUVar13 + (ulong)uVar34 + 1 + uVar50 * 2) = (char)uVar47;
            pUVar12[uVar50 + uVar34] = (uint)uVar46;
            uVar46 = uVar46 + 1;
          } while (uVar46 < (uVar24 & 0xffffffff));
        }
        ms->nextToUpdate = uVar45;
        uVar47 = ms->hashCache[uVar45 & 7];
        ms->hashCache[uVar45 & 7] =
             (U32)((ulong)(*(long *)(pBVar33 + (uVar24 & 0xffffffff) + 8) * -0x30e4432340650000) >>
                  (0x38U - cVar61 & 0x3f));
        uVar24 = (ulong)(uVar47 >> 3 & 0xffffffe0);
        bVar8 = (byte)pUVar13[uVar24];
        pcVar6 = (char *)((long)pUVar13 + uVar24 * 2 + 1);
        pcVar7 = (char *)((long)pUVar13 + uVar24 * 2 + 0x11);
        uVar92 = (undefined1)(uVar47 >> 0x18);
        uVar90 = (undefined1)(uVar47 >> 0x10);
        uVar88 = (undefined1)(uVar47 >> 8);
        auVar94._4_4_ =
             (int)(CONCAT35(CONCAT21(CONCAT11(uVar92,uVar92),uVar90),CONCAT14(uVar90,uVar47)) >>
                  0x20);
        auVar94[3] = uVar88;
        auVar94[2] = uVar88;
        auVar94[0] = (undefined1)uVar47;
        auVar94[1] = auVar94[0];
        auVar94._8_8_ = 0;
        auVar95 = pshuflw(auVar94,auVar94,0);
        cVar61 = auVar95[0];
        auVar52[0] = -(*pcVar6 == cVar61);
        cVar89 = auVar95[1];
        auVar52[1] = -(pcVar6[1] == cVar89);
        cVar91 = auVar95[2];
        auVar52[2] = -(pcVar6[2] == cVar91);
        cVar93 = auVar95[3];
        auVar52[3] = -(pcVar6[3] == cVar93);
        auVar52[4] = -(pcVar6[4] == cVar61);
        auVar52[5] = -(pcVar6[5] == cVar89);
        auVar52[6] = -(pcVar6[6] == cVar91);
        auVar52[7] = -(pcVar6[7] == cVar93);
        auVar52[8] = -(pcVar6[8] == cVar61);
        auVar52[9] = -(pcVar6[9] == cVar89);
        auVar52[10] = -(pcVar6[10] == cVar91);
        auVar52[0xb] = -(pcVar6[0xb] == cVar93);
        auVar52[0xc] = -(pcVar6[0xc] == cVar61);
        auVar52[0xd] = -(pcVar6[0xd] == cVar89);
        auVar52[0xe] = -(pcVar6[0xe] == cVar91);
        auVar52[0xf] = -(pcVar6[0xf] == cVar93);
        auVar62[0] = -(*pcVar7 == cVar61);
        auVar62[1] = -(pcVar7[1] == cVar89);
        auVar62[2] = -(pcVar7[2] == cVar91);
        auVar62[3] = -(pcVar7[3] == cVar93);
        auVar62[4] = -(pcVar7[4] == cVar61);
        auVar62[5] = -(pcVar7[5] == cVar89);
        auVar62[6] = -(pcVar7[6] == cVar91);
        auVar62[7] = -(pcVar7[7] == cVar93);
        auVar62[8] = -(pcVar7[8] == cVar61);
        auVar62[9] = -(pcVar7[9] == cVar89);
        auVar62[10] = -(pcVar7[10] == cVar91);
        auVar62[0xb] = -(pcVar7[0xb] == cVar93);
        auVar62[0xc] = -(pcVar7[0xc] == cVar61);
        auVar62[0xd] = -(pcVar7[0xd] == cVar89);
        auVar62[0xe] = -(pcVar7[0xe] == cVar91);
        auVar62[0xf] = -(pcVar7[0xf] == cVar93);
        uVar34 = CONCAT22((ushort)(SUB161(auVar62 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar62 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar62 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar62 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar62 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar62 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar62 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar62 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar62 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar62 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar62 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar62 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar62 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar62 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar62 >> 0x77,0) & 1) << 0xe |
                          (ushort)(auVar62[0xf] >> 7) << 0xf,
                          (ushort)(SUB161(auVar52 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar52 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar52 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar52 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar52 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar52 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar52 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar52 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar52 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar52 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar52 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar52 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar52 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar52 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar52 >> 0x77,0) & 1) << 0xe |
                          (ushort)(auVar52[0xf] >> 7) << 0xf);
        uVar47 = uVar34 >> (bVar8 & 0x1f) | uVar34 << 0x20 - (bVar8 & 0x1f);
        if ((bVar8 & 0x1f) == 0) {
          uVar47 = uVar34;
        }
        if (uVar47 == 0) {
          uVar46 = 0;
        }
        else {
          uVar46 = 0;
          iVar20 = -0x1f;
          while( true ) {
            iVar43 = 0;
            if (uVar47 != 0) {
              for (; (uVar47 >> iVar43 & 1) == 0; iVar43 = iVar43 + 1) {
              }
            }
            if (pUVar12[uVar24 + (iVar43 + (uint)bVar8 & 0x1f)] < uVar21) break;
            auStack_b8[uVar46] = pUVar12[uVar24 + (iVar43 + (uint)bVar8 & 0x1f)];
            uVar46 = uVar46 + 1;
            uVar47 = uVar47 & uVar47 - 1;
            if ((uVar47 == 0) || (bVar51 = iVar20 == 0, iVar20 = iVar20 + 1, bVar51)) break;
          }
        }
        uVar47 = bVar8 - 1 & 0x1f;
        *(char *)(pUVar13 + uVar24) = (char)uVar47;
        *(undefined1 *)((long)(pUVar13 + uVar24) + (ulong)uVar47 + 1) = auVar94[0];
        UVar48 = ms->nextToUpdate;
        ms->nextToUpdate = UVar48 + 1;
        pUVar12[uVar24 + uVar47] = UVar48;
        if (uVar46 == 0) goto LAB_006f0521;
        local_178 = 999999999;
        uVar24 = 0;
        pBVar27 = (BYTE *)0x3;
        do {
          uVar47 = auStack_b8[uVar24];
          if (uVar47 < uVar30) {
            if (*(int *)(pBVar37 + uVar47) == (int)*puVar40) {
              sVar23 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar40 + 4),pBVar37 + (ulong)uVar47 + 4,
                                  (BYTE *)iEnd,pBVar37 + uVar30,pBVar33 + uVar30);
              pBVar25 = (BYTE *)(sVar23 + 4);
            }
            else {
LAB_006efb7d:
              pBVar25 = (BYTE *)0x0;
            }
          }
          else {
            puVar31 = (ulong *)(pBVar33 + uVar47);
            if (pBVar27[(long)puVar31] != *(BYTE *)((long)puVar40 + (long)pBVar27))
            goto LAB_006efb7d;
            puVar35 = puVar40;
            if (puVar40 < puVar1) {
              uVar26 = *puVar40 ^ *puVar31;
              uVar50 = 0;
              if (uVar26 != 0) {
                for (; (uVar26 >> uVar50 & 1) == 0; uVar50 = uVar50 + 1) {
                }
              }
              pBVar25 = (BYTE *)(uVar50 >> 3 & 0x1fffffff);
              if (*puVar31 == *puVar40) {
                do {
                  puVar35 = puVar35 + 1;
                  puVar31 = puVar31 + 1;
                  if (puVar1 <= puVar35) goto LAB_006efb84;
                  uVar26 = *puVar35 ^ *puVar31;
                  uVar50 = 0;
                  if (uVar26 != 0) {
                    for (; (uVar26 >> uVar50 & 1) == 0; uVar50 = uVar50 + 1) {
                    }
                  }
                  pBVar25 = (BYTE *)((long)puVar35 + ((uVar50 >> 3 & 0x1fffffff) - (long)puVar40));
                } while (*puVar31 == *puVar35);
              }
            }
            else {
LAB_006efb84:
              if ((puVar35 < puVar2) && ((int)*puVar31 == (int)*puVar35)) {
                puVar35 = (ulong *)((long)puVar35 + 4);
                puVar31 = (ulong *)((long)puVar31 + 4);
              }
              if ((puVar35 < puVar3) && ((short)*puVar31 == (short)*puVar35)) {
                puVar35 = (ulong *)((long)puVar35 + 2);
                puVar31 = (ulong *)((long)puVar31 + 2);
              }
              if (puVar35 < iEnd) {
                puVar35 = (ulong *)((long)puVar35 + (ulong)((BYTE)*puVar31 == (BYTE)*puVar35));
              }
              pBVar25 = (BYTE *)((long)puVar35 - (long)puVar40);
            }
          }
          pBVar38 = pBVar27;
          if (pBVar27 < pBVar25) {
            pBVar38 = pBVar25;
            local_178 = (ulong)((uVar45 + 2) - uVar47);
          }
        } while ((pBVar25 <= pBVar27 || (ulong *)((long)puVar40 + (long)pBVar25) != iEnd) &&
                (uVar24 = uVar24 + 1, pBVar27 = pBVar38, uVar24 < uVar46));
      }
      else if (uVar21 == 5) {
        pBVar33 = (ms->window).base;
        pBVar37 = (ms->window).dictBase;
        uVar30 = (ms->window).dictLimit;
        uVar24 = (long)puVar40 - (long)pBVar33;
        uVar34 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        uVar45 = (uint)uVar24;
        uVar21 = uVar45 - uVar34;
        if (uVar45 - uVar47 <= uVar34) {
          uVar21 = uVar47;
        }
        pUVar12 = ms->hashTable;
        pUVar13 = ms->tagTable;
        if (UVar48 != 0) {
          uVar21 = uVar47;
        }
        uVar46 = (ulong)ms->nextToUpdate;
        cVar61 = (char)ms->rowHashLog;
        if (ms->nextToUpdate < uVar45) {
          do {
            uVar34 = (uint)uVar46 & 7;
            uVar47 = ms->hashCache[uVar34];
            ms->hashCache[uVar34] =
                 (U32)((ulong)(*(long *)(pBVar33 + uVar46 + 8) * -0x30e4432345000000) >>
                      (0x38U - cVar61 & 0x3f));
            uVar50 = (ulong)(uVar47 >> 3 & 0xffffffe0);
            uVar34 = (byte)((char)pUVar13[uVar50] - 1) & 0x1f;
            *(char *)(pUVar13 + uVar50) = (char)uVar34;
            *(char *)((long)pUVar13 + (ulong)uVar34 + 1 + uVar50 * 2) = (char)uVar47;
            pUVar12[uVar50 + uVar34] = (uint)uVar46;
            uVar46 = uVar46 + 1;
          } while (uVar46 < (uVar24 & 0xffffffff));
        }
        ms->nextToUpdate = uVar45;
        uVar47 = ms->hashCache[uVar45 & 7];
        ms->hashCache[uVar45 & 7] =
             (U32)((ulong)(*(long *)(pBVar33 + (uVar24 & 0xffffffff) + 8) * -0x30e4432345000000) >>
                  (0x38U - cVar61 & 0x3f));
        uVar24 = (ulong)(uVar47 >> 3 & 0xffffffe0);
        bVar8 = (byte)pUVar13[uVar24];
        pcVar6 = (char *)((long)pUVar13 + uVar24 * 2 + 1);
        pcVar7 = (char *)((long)pUVar13 + uVar24 * 2 + 0x11);
        uVar92 = (undefined1)(uVar47 >> 0x18);
        uVar90 = (undefined1)(uVar47 >> 0x10);
        uVar88 = (undefined1)(uVar47 >> 8);
        auVar96._4_4_ =
             (int)(CONCAT35(CONCAT21(CONCAT11(uVar92,uVar92),uVar90),CONCAT14(uVar90,uVar47)) >>
                  0x20);
        auVar96[3] = uVar88;
        auVar96[2] = uVar88;
        auVar96[0] = (undefined1)uVar47;
        auVar96[1] = auVar96[0];
        auVar96._8_8_ = 0;
        auVar95 = pshuflw(auVar96,auVar96,0);
        cVar61 = auVar95[0];
        auVar53[0] = -(*pcVar6 == cVar61);
        cVar89 = auVar95[1];
        auVar53[1] = -(pcVar6[1] == cVar89);
        cVar91 = auVar95[2];
        auVar53[2] = -(pcVar6[2] == cVar91);
        cVar93 = auVar95[3];
        auVar53[3] = -(pcVar6[3] == cVar93);
        auVar53[4] = -(pcVar6[4] == cVar61);
        auVar53[5] = -(pcVar6[5] == cVar89);
        auVar53[6] = -(pcVar6[6] == cVar91);
        auVar53[7] = -(pcVar6[7] == cVar93);
        auVar53[8] = -(pcVar6[8] == cVar61);
        auVar53[9] = -(pcVar6[9] == cVar89);
        auVar53[10] = -(pcVar6[10] == cVar91);
        auVar53[0xb] = -(pcVar6[0xb] == cVar93);
        auVar53[0xc] = -(pcVar6[0xc] == cVar61);
        auVar53[0xd] = -(pcVar6[0xd] == cVar89);
        auVar53[0xe] = -(pcVar6[0xe] == cVar91);
        auVar53[0xf] = -(pcVar6[0xf] == cVar93);
        auVar65[0] = -(*pcVar7 == cVar61);
        auVar65[1] = -(pcVar7[1] == cVar89);
        auVar65[2] = -(pcVar7[2] == cVar91);
        auVar65[3] = -(pcVar7[3] == cVar93);
        auVar65[4] = -(pcVar7[4] == cVar61);
        auVar65[5] = -(pcVar7[5] == cVar89);
        auVar65[6] = -(pcVar7[6] == cVar91);
        auVar65[7] = -(pcVar7[7] == cVar93);
        auVar65[8] = -(pcVar7[8] == cVar61);
        auVar65[9] = -(pcVar7[9] == cVar89);
        auVar65[10] = -(pcVar7[10] == cVar91);
        auVar65[0xb] = -(pcVar7[0xb] == cVar93);
        auVar65[0xc] = -(pcVar7[0xc] == cVar61);
        auVar65[0xd] = -(pcVar7[0xd] == cVar89);
        auVar65[0xe] = -(pcVar7[0xe] == cVar91);
        auVar65[0xf] = -(pcVar7[0xf] == cVar93);
        uVar34 = CONCAT22((ushort)(SUB161(auVar65 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar65 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar65 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar65 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar65 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar65 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar65 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar65 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar65 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar65 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar65 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar65 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar65 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar65 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar65 >> 0x77,0) & 1) << 0xe |
                          (ushort)(auVar65[0xf] >> 7) << 0xf,
                          (ushort)(SUB161(auVar53 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar53 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar53 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar53 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar53 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar53 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar53 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar53 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar53 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar53 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar53 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar53 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar53 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar53 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar53 >> 0x77,0) & 1) << 0xe |
                          (ushort)(auVar53[0xf] >> 7) << 0xf);
        uVar47 = uVar34 >> (bVar8 & 0x1f) | uVar34 << 0x20 - (bVar8 & 0x1f);
        if ((bVar8 & 0x1f) == 0) {
          uVar47 = uVar34;
        }
        if (uVar47 == 0) {
          uVar46 = 0;
        }
        else {
          uVar46 = 0;
          iVar20 = -0x1f;
          while( true ) {
            iVar43 = 0;
            if (uVar47 != 0) {
              for (; (uVar47 >> iVar43 & 1) == 0; iVar43 = iVar43 + 1) {
              }
            }
            if (pUVar12[uVar24 + (iVar43 + (uint)bVar8 & 0x1f)] < uVar21) break;
            auStack_b8[uVar46] = pUVar12[uVar24 + (iVar43 + (uint)bVar8 & 0x1f)];
            uVar46 = uVar46 + 1;
            uVar47 = uVar47 & uVar47 - 1;
            if ((uVar47 == 0) || (bVar51 = iVar20 == 0, iVar20 = iVar20 + 1, bVar51)) break;
          }
        }
        uVar47 = bVar8 - 1 & 0x1f;
        *(char *)(pUVar13 + uVar24) = (char)uVar47;
        *(undefined1 *)((long)(pUVar13 + uVar24) + (ulong)uVar47 + 1) = auVar96[0];
        UVar48 = ms->nextToUpdate;
        ms->nextToUpdate = UVar48 + 1;
        pUVar12[uVar24 + uVar47] = UVar48;
        if (uVar46 == 0) {
LAB_006f0521:
          pBVar38 = (BYTE *)0x3;
          local_178 = 999999999;
        }
        else {
          local_178 = 999999999;
          uVar24 = 0;
          pBVar27 = (BYTE *)0x3;
          do {
            uVar47 = auStack_b8[uVar24];
            if (uVar47 < uVar30) {
              if (*(int *)(pBVar37 + uVar47) == (int)*puVar40) {
                sVar23 = ZSTD_count_2segments
                                   ((BYTE *)((long)puVar40 + 4),pBVar37 + (ulong)uVar47 + 4,
                                    (BYTE *)iEnd,pBVar37 + uVar30,pBVar33 + uVar30);
                pBVar25 = (BYTE *)(sVar23 + 4);
              }
              else {
LAB_006eff20:
                pBVar25 = (BYTE *)0x0;
              }
            }
            else {
              puVar31 = (ulong *)(pBVar33 + uVar47);
              if (pBVar27[(long)puVar31] != *(BYTE *)((long)puVar40 + (long)pBVar27))
              goto LAB_006eff20;
              puVar35 = puVar40;
              if (puVar40 < puVar1) {
                uVar26 = *puVar40 ^ *puVar31;
                uVar50 = 0;
                if (uVar26 != 0) {
                  for (; (uVar26 >> uVar50 & 1) == 0; uVar50 = uVar50 + 1) {
                  }
                }
                pBVar25 = (BYTE *)(uVar50 >> 3 & 0x1fffffff);
                if (*puVar31 == *puVar40) {
                  do {
                    puVar35 = puVar35 + 1;
                    puVar31 = puVar31 + 1;
                    if (puVar1 <= puVar35) goto LAB_006eff27;
                    uVar26 = *puVar35 ^ *puVar31;
                    uVar50 = 0;
                    if (uVar26 != 0) {
                      for (; (uVar26 >> uVar50 & 1) == 0; uVar50 = uVar50 + 1) {
                      }
                    }
                    pBVar25 = (BYTE *)((long)puVar35 + ((uVar50 >> 3 & 0x1fffffff) - (long)puVar40))
                    ;
                  } while (*puVar31 == *puVar35);
                }
              }
              else {
LAB_006eff27:
                if ((puVar35 < puVar2) && ((int)*puVar31 == (int)*puVar35)) {
                  puVar35 = (ulong *)((long)puVar35 + 4);
                  puVar31 = (ulong *)((long)puVar31 + 4);
                }
                if ((puVar35 < puVar3) && ((short)*puVar31 == (short)*puVar35)) {
                  puVar35 = (ulong *)((long)puVar35 + 2);
                  puVar31 = (ulong *)((long)puVar31 + 2);
                }
                if (puVar35 < iEnd) {
                  puVar35 = (ulong *)((long)puVar35 + (ulong)((BYTE)*puVar31 == (BYTE)*puVar35));
                }
                pBVar25 = (BYTE *)((long)puVar35 - (long)puVar40);
              }
            }
            pBVar38 = pBVar27;
            if (pBVar27 < pBVar25) {
              pBVar38 = pBVar25;
              local_178 = (ulong)((uVar45 + 2) - uVar47);
            }
          } while ((pBVar25 <= pBVar27 || (ulong *)((long)puVar40 + (long)pBVar25) != iEnd) &&
                  (uVar24 = uVar24 + 1, pBVar27 = pBVar38, uVar24 < uVar46));
        }
      }
      else {
        pBVar33 = (ms->window).base;
        pBVar37 = (ms->window).dictBase;
        uVar30 = (ms->window).dictLimit;
        uVar24 = (long)puVar40 - (long)pBVar33;
        uVar34 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        uVar45 = (uint)uVar24;
        uVar21 = uVar45 - uVar34;
        if (uVar45 - uVar47 <= uVar34) {
          uVar21 = uVar47;
        }
        pUVar12 = ms->hashTable;
        pUVar13 = ms->tagTable;
        if (UVar48 != 0) {
          uVar21 = uVar47;
        }
        uVar46 = (ulong)ms->nextToUpdate;
        cVar61 = (char)ms->rowHashLog;
        if (ms->nextToUpdate < uVar45) {
          do {
            uVar34 = (uint)uVar46 & 7;
            uVar47 = ms->hashCache[uVar34];
            ms->hashCache[uVar34] =
                 (uint)(*(int *)(pBVar33 + uVar46 + 8) * -0x61c8864f) >> (0x18U - cVar61 & 0x1f);
            uVar50 = (ulong)(uVar47 >> 3 & 0xffffffe0);
            uVar34 = (byte)((char)pUVar13[uVar50] - 1) & 0x1f;
            *(char *)(pUVar13 + uVar50) = (char)uVar34;
            *(char *)((long)pUVar13 + (ulong)uVar34 + 1 + uVar50 * 2) = (char)uVar47;
            pUVar12[uVar50 + uVar34] = (uint)uVar46;
            uVar46 = uVar46 + 1;
          } while (uVar46 < (uVar24 & 0xffffffff));
        }
        ms->nextToUpdate = uVar45;
        uVar47 = ms->hashCache[uVar45 & 7];
        ms->hashCache[uVar45 & 7] =
             (uint)(*(int *)(pBVar33 + (uVar24 & 0xffffffff) + 8) * -0x61c8864f) >>
             (0x18U - cVar61 & 0x1f);
        uVar24 = (ulong)(uVar47 >> 3 & 0xffffffe0);
        bVar8 = (byte)pUVar13[uVar24];
        pcVar6 = (char *)((long)pUVar13 + uVar24 * 2 + 1);
        pcVar7 = (char *)((long)pUVar13 + uVar24 * 2 + 0x11);
        uVar92 = (undefined1)(uVar47 >> 0x18);
        uVar90 = (undefined1)(uVar47 >> 0x10);
        uVar88 = (undefined1)(uVar47 >> 8);
        auVar97._4_4_ =
             (int)(CONCAT35(CONCAT21(CONCAT11(uVar92,uVar92),uVar90),CONCAT14(uVar90,uVar47)) >>
                  0x20);
        auVar97[3] = uVar88;
        auVar97[2] = uVar88;
        auVar97[0] = (undefined1)uVar47;
        auVar97[1] = auVar97[0];
        auVar97._8_8_ = 0;
        auVar95 = pshuflw(auVar97,auVar97,0);
        cVar61 = auVar95[0];
        auVar54[0] = -(*pcVar6 == cVar61);
        cVar89 = auVar95[1];
        auVar54[1] = -(pcVar6[1] == cVar89);
        cVar91 = auVar95[2];
        auVar54[2] = -(pcVar6[2] == cVar91);
        cVar93 = auVar95[3];
        auVar54[3] = -(pcVar6[3] == cVar93);
        auVar54[4] = -(pcVar6[4] == cVar61);
        auVar54[5] = -(pcVar6[5] == cVar89);
        auVar54[6] = -(pcVar6[6] == cVar91);
        auVar54[7] = -(pcVar6[7] == cVar93);
        auVar54[8] = -(pcVar6[8] == cVar61);
        auVar54[9] = -(pcVar6[9] == cVar89);
        auVar54[10] = -(pcVar6[10] == cVar91);
        auVar54[0xb] = -(pcVar6[0xb] == cVar93);
        auVar54[0xc] = -(pcVar6[0xc] == cVar61);
        auVar54[0xd] = -(pcVar6[0xd] == cVar89);
        auVar54[0xe] = -(pcVar6[0xe] == cVar91);
        auVar54[0xf] = -(pcVar6[0xf] == cVar93);
        auVar67[0] = -(*pcVar7 == cVar61);
        auVar67[1] = -(pcVar7[1] == cVar89);
        auVar67[2] = -(pcVar7[2] == cVar91);
        auVar67[3] = -(pcVar7[3] == cVar93);
        auVar67[4] = -(pcVar7[4] == cVar61);
        auVar67[5] = -(pcVar7[5] == cVar89);
        auVar67[6] = -(pcVar7[6] == cVar91);
        auVar67[7] = -(pcVar7[7] == cVar93);
        auVar67[8] = -(pcVar7[8] == cVar61);
        auVar67[9] = -(pcVar7[9] == cVar89);
        auVar67[10] = -(pcVar7[10] == cVar91);
        auVar67[0xb] = -(pcVar7[0xb] == cVar93);
        auVar67[0xc] = -(pcVar7[0xc] == cVar61);
        auVar67[0xd] = -(pcVar7[0xd] == cVar89);
        auVar67[0xe] = -(pcVar7[0xe] == cVar91);
        auVar67[0xf] = -(pcVar7[0xf] == cVar93);
        uVar34 = CONCAT22((ushort)(SUB161(auVar67 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar67 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar67 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar67 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar67 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar67 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar67 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar67 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar67 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar67 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar67 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar67 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar67 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar67 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar67 >> 0x77,0) & 1) << 0xe |
                          (ushort)(auVar67[0xf] >> 7) << 0xf,
                          (ushort)(SUB161(auVar54 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar54 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar54 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar54 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar54 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar54 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar54 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar54 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar54 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar54 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar54 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar54 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar54 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar54 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar54 >> 0x77,0) & 1) << 0xe |
                          (ushort)(auVar54[0xf] >> 7) << 0xf);
        uVar47 = uVar34 >> (bVar8 & 0x1f) | uVar34 << 0x20 - (bVar8 & 0x1f);
        if ((bVar8 & 0x1f) == 0) {
          uVar47 = uVar34;
        }
        if (uVar47 == 0) {
          uVar46 = 0;
        }
        else {
          uVar46 = 0;
          iVar20 = -0x1f;
          while( true ) {
            iVar43 = 0;
            if (uVar47 != 0) {
              for (; (uVar47 >> iVar43 & 1) == 0; iVar43 = iVar43 + 1) {
              }
            }
            if (pUVar12[uVar24 + (iVar43 + (uint)bVar8 & 0x1f)] < uVar21) break;
            auStack_b8[uVar46] = pUVar12[uVar24 + (iVar43 + (uint)bVar8 & 0x1f)];
            uVar46 = uVar46 + 1;
            uVar47 = uVar47 & uVar47 - 1;
            if ((uVar47 == 0) || (bVar51 = iVar20 == 0, iVar20 = iVar20 + 1, bVar51)) break;
          }
        }
        uVar47 = bVar8 - 1 & 0x1f;
        *(char *)(pUVar13 + uVar24) = (char)uVar47;
        *(undefined1 *)((long)(pUVar13 + uVar24) + (ulong)uVar47 + 1) = auVar97[0];
        UVar48 = ms->nextToUpdate;
        ms->nextToUpdate = UVar48 + 1;
        pUVar12[uVar24 + uVar47] = UVar48;
        if (uVar46 == 0) goto LAB_006f0521;
        local_178 = 999999999;
        uVar24 = 0;
        pBVar27 = (BYTE *)0x3;
        do {
          uVar47 = auStack_b8[uVar24];
          if (uVar47 < uVar30) {
            if (*(int *)(pBVar37 + uVar47) == (int)*puVar40) {
              sVar23 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar40 + 4),pBVar37 + (ulong)uVar47 + 4,
                                  (BYTE *)iEnd,pBVar37 + uVar30,pBVar33 + uVar30);
              pBVar25 = (BYTE *)(sVar23 + 4);
            }
            else {
LAB_006f02cc:
              pBVar25 = (BYTE *)0x0;
            }
          }
          else {
            puVar31 = (ulong *)(pBVar33 + uVar47);
            if (pBVar27[(long)puVar31] != *(BYTE *)((long)puVar40 + (long)pBVar27))
            goto LAB_006f02cc;
            puVar35 = puVar40;
            if (puVar40 < puVar1) {
              uVar26 = *puVar40 ^ *puVar31;
              uVar50 = 0;
              if (uVar26 != 0) {
                for (; (uVar26 >> uVar50 & 1) == 0; uVar50 = uVar50 + 1) {
                }
              }
              pBVar25 = (BYTE *)(uVar50 >> 3 & 0x1fffffff);
              if (*puVar31 == *puVar40) {
                do {
                  puVar35 = puVar35 + 1;
                  puVar31 = puVar31 + 1;
                  if (puVar1 <= puVar35) goto LAB_006f02d3;
                  uVar26 = *puVar35 ^ *puVar31;
                  uVar50 = 0;
                  if (uVar26 != 0) {
                    for (; (uVar26 >> uVar50 & 1) == 0; uVar50 = uVar50 + 1) {
                    }
                  }
                  pBVar25 = (BYTE *)((long)puVar35 + ((uVar50 >> 3 & 0x1fffffff) - (long)puVar40));
                } while (*puVar31 == *puVar35);
              }
            }
            else {
LAB_006f02d3:
              if ((puVar35 < puVar2) && ((int)*puVar31 == (int)*puVar35)) {
                puVar35 = (ulong *)((long)puVar35 + 4);
                puVar31 = (ulong *)((long)puVar31 + 4);
              }
              if ((puVar35 < puVar3) && ((short)*puVar31 == (short)*puVar35)) {
                puVar35 = (ulong *)((long)puVar35 + 2);
                puVar31 = (ulong *)((long)puVar31 + 2);
              }
              if (puVar35 < iEnd) {
                puVar35 = (ulong *)((long)puVar35 + (ulong)((BYTE)*puVar31 == (BYTE)*puVar35));
              }
              pBVar25 = (BYTE *)((long)puVar35 - (long)puVar40);
            }
          }
          pBVar38 = pBVar27;
          if (pBVar27 < pBVar25) {
            pBVar38 = pBVar25;
            local_178 = (ulong)((uVar45 + 2) - uVar47);
          }
        } while ((pBVar25 <= pBVar27 || (ulong *)((long)puVar40 + (long)pBVar25) != iEnd) &&
                (uVar24 = uVar24 + 1, pBVar27 = pBVar38, uVar24 < uVar46));
      }
      local_160 = pBVar49;
      if (pBVar49 < pBVar38) {
        local_160 = pBVar38;
      }
      if (local_160 < (BYTE *)0x4) {
        puVar40 = (ulong *)((long)puVar40 + ((long)puVar40 - (long)local_110 >> 8) + 1);
      }
      else {
        puVar31 = puVar40;
        if (pBVar38 <= pBVar49) {
          local_178 = 0;
          puVar31 = (ulong *)((long)puVar40 + 1U);
        }
        do {
          do {
            puVar35 = puVar40;
            iVar20 = iVar39;
            if (iLimit <= puVar35) goto LAB_006f36dc;
            puVar40 = (ulong *)((long)puVar35 + 1);
            iVar39 = iVar20 + 1;
            if (local_178 == 0) {
              local_178 = 0;
            }
            else {
              UVar48 = (ms->window).lowLimit;
              UVar29 = iVar39 - uVar18;
              if (iVar39 - UVar48 <= uVar18) {
                UVar29 = UVar48;
              }
              if (ms->loadedDictEnd != 0) {
                UVar29 = UVar48;
              }
              uVar47 = iVar39 - local_144;
              pBVar33 = base_00;
              if (uVar47 < uVar9) {
                pBVar33 = pBVar11;
              }
              if (((2 < iVar19 - uVar47) && (local_144 < iVar39 - UVar29)) &&
                 (*(int *)puVar40 == *(int *)(pBVar33 + uVar47))) {
                puVar32 = iEnd;
                if (uVar47 < uVar9) {
                  puVar32 = puVar22;
                }
                sVar23 = ZSTD_count_2segments
                                   ((BYTE *)((long)puVar35 + 5),
                                    (BYTE *)((long)(pBVar33 + uVar47) + 4),(BYTE *)iEnd,
                                    (BYTE *)puVar32,iStart);
                if (sVar23 < 0xfffffffffffffffc) {
                  uVar30 = (int)local_178 + 1;
                  uVar47 = 0x1f;
                  if (uVar30 != 0) {
                    for (; uVar30 >> uVar47 == 0; uVar47 = uVar47 - 1) {
                    }
                  }
                  if ((int)((uVar47 ^ 0x1f) + (int)local_160 * 3 + -0x1e) <
                      (int)(BYTE *)(sVar23 + 4) * 3) {
                    local_178 = 0;
                    puVar31 = puVar40;
                    local_160 = (BYTE *)(sVar23 + 4);
                  }
                }
              }
            }
            uVar47 = (ms->cParams).searchLog;
            uVar30 = (ms->cParams).minMatch;
            if (uVar47 < 5) {
              if (uVar30 - 6 < 2) {
                pUVar12 = ms->hashTable;
                pUVar13 = ms->tagTable;
                pBVar33 = (ms->window).base;
                uVar24 = (long)puVar40 - (long)pBVar33;
                uVar34 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
                uVar30 = (ms->window).lowLimit;
                uVar45 = (uint)uVar24;
                uVar21 = uVar45 - uVar34;
                if (uVar45 - uVar30 <= uVar34) {
                  uVar21 = uVar30;
                }
                if (ms->loadedDictEnd != 0) {
                  uVar21 = uVar30;
                }
                if (3 < uVar47) {
                  uVar47 = 4;
                }
                iVar43 = 1 << ((byte)uVar47 & 0x1f);
                pBVar49 = (ms->window).dictBase;
                uVar47 = (ms->window).dictLimit;
                uVar46 = (ulong)ms->nextToUpdate;
                local_198 = (char)ms->rowHashLog;
                if (ms->nextToUpdate < uVar45) {
                  do {
                    uVar34 = (uint)uVar46 & 7;
                    uVar30 = ms->hashCache[uVar34];
                    ms->hashCache[uVar34] =
                         (U32)((ulong)(*(long *)(pBVar33 + uVar46 + 8) * -0x30e4432340650000) >>
                              (0x38U - local_198 & 0x3f));
                    uVar50 = (ulong)(uVar30 >> 4 & 0xffffff0);
                    uVar34 = (byte)((char)pUVar13[uVar50] - 1) & 0xf;
                    *(char *)(pUVar13 + uVar50) = (char)uVar34;
                    *(char *)((long)pUVar13 + (ulong)uVar34 + 1 + uVar50 * 2) = (char)uVar30;
                    pUVar12[uVar50 + uVar34] = (uint)uVar46;
                    uVar46 = uVar46 + 1;
                  } while ((uVar24 & 0xffffffff) != uVar46);
                }
                ms->nextToUpdate = uVar45;
                uVar30 = ms->hashCache[uVar45 & 7];
                ms->hashCache[uVar45 & 7] =
                     (U32)((ulong)(*(long *)(pBVar33 + (uVar24 & 0xffffffff) + 8) *
                                  -0x30e4432340650000) >> (0x38U - local_198 & 0x3f));
                uVar24 = (ulong)(uVar30 >> 4 & 0xfffffff0);
                bVar8 = (byte)pUVar13[uVar24];
                pcVar6 = (char *)((long)pUVar13 + uVar24 * 2 + 1);
                uVar92 = (undefined1)(uVar30 >> 0x18);
                uVar90 = (undefined1)(uVar30 >> 0x10);
                uVar88 = (undefined1)(uVar30 >> 8);
                auVar71._4_4_ =
                     (int)(CONCAT35(CONCAT21(CONCAT11(uVar92,uVar92),uVar90),CONCAT14(uVar90,uVar30)
                                   ) >> 0x20);
                auVar71[3] = uVar88;
                auVar71[2] = uVar88;
                auVar71[0] = (undefined1)uVar30;
                auVar71[1] = auVar71[0];
                auVar71._8_8_ = 0;
                auVar95 = pshuflw(auVar71,auVar71,0);
                cVar61 = auVar95[0];
                auVar72[0] = -(cVar61 == *pcVar6);
                cVar89 = auVar95[1];
                auVar72[1] = -(cVar89 == pcVar6[1]);
                cVar91 = auVar95[2];
                auVar72[2] = -(cVar91 == pcVar6[2]);
                cVar93 = auVar95[3];
                auVar72[3] = -(cVar93 == pcVar6[3]);
                auVar72[4] = -(cVar61 == pcVar6[4]);
                auVar72[5] = -(cVar89 == pcVar6[5]);
                auVar72[6] = -(cVar91 == pcVar6[6]);
                auVar72[7] = -(cVar93 == pcVar6[7]);
                auVar72[8] = -(cVar61 == pcVar6[8]);
                auVar72[9] = -(cVar89 == pcVar6[9]);
                auVar72[10] = -(cVar91 == pcVar6[10]);
                auVar72[0xb] = -(cVar93 == pcVar6[0xb]);
                auVar72[0xc] = -(cVar61 == pcVar6[0xc]);
                auVar72[0xd] = -(cVar89 == pcVar6[0xd]);
                auVar72[0xe] = -(cVar91 == pcVar6[0xe]);
                auVar72[0xf] = -(cVar93 == pcVar6[0xf]);
                uVar16 = (ushort)(SUB161(auVar72 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar72 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar72 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar72 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar72 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar72 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar72 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar72 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar72 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar72 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar72 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar72 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar72 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar72 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar72 >> 0x77,0) & 1) << 0xe |
                         (ushort)(auVar72[0xf] >> 7) << 0xf;
                uVar30 = (uint)uVar16;
                if ((bVar8 & 0xf) != 0) {
                  uVar30 = (uint)uVar16 << (0x10 - (bVar8 & 0xf) & 0x1f) & 0xfffe |
                           (uint)(uVar16 >> (bVar8 & 0xf));
                }
                if (uVar30 == 0) {
                  uVar46 = 0;
                }
                else {
                  uVar46 = 0;
                  while( true ) {
                    iVar43 = iVar43 + -1;
                    iVar15 = 0;
                    if (uVar30 != 0) {
                      for (; (uVar30 >> iVar15 & 1) == 0; iVar15 = iVar15 + 1) {
                      }
                    }
                    if (pUVar12[uVar24 + (iVar15 + (uint)bVar8 & 0xf)] < uVar21) break;
                    auStack_b8[uVar46] = pUVar12[uVar24 + (iVar15 + (uint)bVar8 & 0xf)];
                    uVar46 = uVar46 + 1;
                    uVar30 = uVar30 & uVar30 - 1;
                    if ((uVar30 == 0) || (iVar43 == 0)) break;
                  }
                }
                uVar30 = bVar8 - 1 & 0xf;
                *(char *)(pUVar13 + uVar24) = (char)uVar30;
                *(undefined1 *)((long)(pUVar13 + uVar24) + (ulong)uVar30 + 1) = auVar71[0];
                UVar48 = ms->nextToUpdate;
                ms->nextToUpdate = UVar48 + 1;
                pUVar12[uVar24 + uVar30] = UVar48;
                if (uVar46 == 0) goto LAB_006f1dc3;
                uVar24 = 999999999;
                uVar50 = 0;
                pBVar37 = (BYTE *)0x3;
                do {
                  uVar30 = auStack_b8[uVar50];
                  if (uVar30 < uVar47) {
                    if (*(int *)(pBVar49 + uVar30) == *(int *)puVar40) {
                      sVar23 = ZSTD_count_2segments
                                         ((BYTE *)((long)puVar35 + 5),pBVar49 + (ulong)uVar30 + 4,
                                          (BYTE *)iEnd,pBVar49 + uVar47,pBVar33 + uVar47);
                      pBVar27 = (BYTE *)(sVar23 + 4);
                    }
                    else {
LAB_006f15ce:
                      pBVar27 = (BYTE *)0x0;
                    }
                  }
                  else {
                    puVar32 = (ulong *)(pBVar33 + uVar30);
                    if (pBVar37[(long)puVar32] != *(BYTE *)((long)puVar40 + (long)pBVar37))
                    goto LAB_006f15ce;
                    puVar36 = puVar40;
                    if (puVar40 < puVar1) {
                      uVar28 = *puVar40 ^ *puVar32;
                      uVar26 = 0;
                      if (uVar28 != 0) {
                        for (; (uVar28 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                        }
                      }
                      pBVar27 = (BYTE *)(uVar26 >> 3 & 0x1fffffff);
                      puVar36 = (ulong *)((long)puVar35 + 9);
                      if (*puVar32 == *puVar40) {
                        do {
                          puVar32 = puVar32 + 1;
                          if (puVar1 <= puVar36) goto LAB_006f15db;
                          uVar26 = *puVar36;
                          uVar44 = uVar26 ^ *puVar32;
                          uVar28 = 0;
                          if (uVar44 != 0) {
                            for (; (uVar44 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                            }
                          }
                          pBVar27 = (BYTE *)((long)puVar36 +
                                            ((uVar28 >> 3 & 0x1fffffff) - (long)puVar40));
                          puVar36 = puVar36 + 1;
                        } while (*puVar32 == uVar26);
                      }
                    }
                    else {
LAB_006f15db:
                      if ((puVar36 < puVar2) && ((int)*puVar32 == (int)*puVar36)) {
                        puVar36 = (ulong *)((long)puVar36 + 4);
                        puVar32 = (ulong *)((long)puVar32 + 4);
                      }
                      if ((puVar36 < puVar3) && ((short)*puVar32 == (short)*puVar36)) {
                        puVar36 = (ulong *)((long)puVar36 + 2);
                        puVar32 = (ulong *)((long)puVar32 + 2);
                      }
                      if (puVar36 < iEnd) {
                        puVar36 = (ulong *)((long)puVar36 +
                                           (ulong)((BYTE)*puVar32 == (BYTE)*puVar36));
                      }
                      pBVar27 = (BYTE *)((long)puVar36 - (long)puVar40);
                    }
                  }
                  pBVar25 = pBVar37;
                  if (pBVar37 < pBVar27) {
                    pBVar25 = pBVar27;
                    uVar24 = (ulong)((uVar45 + 2) - uVar30);
                  }
                } while ((pBVar27 <= pBVar37 || (ulong *)((long)puVar40 + (long)pBVar27) != iEnd) &&
                        (uVar50 = uVar50 + 1, pBVar37 = pBVar25, uVar50 < uVar46));
              }
              else if (uVar30 == 5) {
                pUVar12 = ms->hashTable;
                pUVar13 = ms->tagTable;
                pBVar33 = (ms->window).base;
                uVar24 = (long)puVar40 - (long)pBVar33;
                uVar34 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
                uVar30 = (ms->window).lowLimit;
                uVar45 = (uint)uVar24;
                uVar21 = uVar45 - uVar34;
                if (uVar45 - uVar30 <= uVar34) {
                  uVar21 = uVar30;
                }
                if (ms->loadedDictEnd != 0) {
                  uVar21 = uVar30;
                }
                if (3 < uVar47) {
                  uVar47 = 4;
                }
                iVar43 = 1 << ((byte)uVar47 & 0x1f);
                pBVar49 = (ms->window).dictBase;
                uVar47 = (ms->window).dictLimit;
                uVar46 = (ulong)ms->nextToUpdate;
                local_1b0 = (char)ms->rowHashLog;
                if (ms->nextToUpdate < uVar45) {
                  do {
                    uVar34 = (uint)uVar46 & 7;
                    uVar30 = ms->hashCache[uVar34];
                    ms->hashCache[uVar34] =
                         (U32)((ulong)(*(long *)(pBVar33 + uVar46 + 8) * -0x30e4432345000000) >>
                              (0x38U - local_1b0 & 0x3f));
                    uVar50 = (ulong)(uVar30 >> 4 & 0xfffffff0);
                    uVar34 = (byte)((char)pUVar13[uVar50] - 1) & 0xf;
                    *(char *)(pUVar13 + uVar50) = (char)uVar34;
                    *(char *)((long)pUVar13 + (ulong)uVar34 + 1 + uVar50 * 2) = (char)uVar30;
                    pUVar12[uVar50 + uVar34] = (uint)uVar46;
                    uVar46 = uVar46 + 1;
                  } while ((uVar24 & 0xffffffff) != uVar46);
                }
                ms->nextToUpdate = uVar45;
                uVar30 = ms->hashCache[uVar45 & 7];
                ms->hashCache[uVar45 & 7] =
                     (U32)((ulong)(*(long *)(pBVar33 + (uVar24 & 0xffffffff) + 8) *
                                  -0x30e4432345000000) >> (0x38U - local_1b0 & 0x3f));
                uVar24 = (ulong)(uVar30 >> 4 & 0xfffffff0);
                bVar8 = (byte)pUVar13[uVar24];
                pcVar6 = (char *)((long)pUVar13 + uVar24 * 2 + 1);
                uVar92 = (undefined1)(uVar30 >> 0x18);
                uVar90 = (undefined1)(uVar30 >> 0x10);
                uVar88 = (undefined1)(uVar30 >> 8);
                auVar74._4_4_ =
                     (int)(CONCAT35(CONCAT21(CONCAT11(uVar92,uVar92),uVar90),CONCAT14(uVar90,uVar30)
                                   ) >> 0x20);
                auVar74[3] = uVar88;
                auVar74[2] = uVar88;
                auVar74[0] = (undefined1)uVar30;
                auVar74[1] = auVar74[0];
                auVar74._8_8_ = 0;
                auVar95 = pshuflw(auVar74,auVar74,0);
                cVar61 = auVar95[0];
                auVar75[0] = -(cVar61 == *pcVar6);
                cVar89 = auVar95[1];
                auVar75[1] = -(cVar89 == pcVar6[1]);
                cVar91 = auVar95[2];
                auVar75[2] = -(cVar91 == pcVar6[2]);
                cVar93 = auVar95[3];
                auVar75[3] = -(cVar93 == pcVar6[3]);
                auVar75[4] = -(cVar61 == pcVar6[4]);
                auVar75[5] = -(cVar89 == pcVar6[5]);
                auVar75[6] = -(cVar91 == pcVar6[6]);
                auVar75[7] = -(cVar93 == pcVar6[7]);
                auVar75[8] = -(cVar61 == pcVar6[8]);
                auVar75[9] = -(cVar89 == pcVar6[9]);
                auVar75[10] = -(cVar91 == pcVar6[10]);
                auVar75[0xb] = -(cVar93 == pcVar6[0xb]);
                auVar75[0xc] = -(cVar61 == pcVar6[0xc]);
                auVar75[0xd] = -(cVar89 == pcVar6[0xd]);
                auVar75[0xe] = -(cVar91 == pcVar6[0xe]);
                auVar75[0xf] = -(cVar93 == pcVar6[0xf]);
                uVar16 = (ushort)(SUB161(auVar75 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar75 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar75 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar75 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar75 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar75 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar75 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar75 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar75 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar75 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar75 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar75 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar75 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar75 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar75 >> 0x77,0) & 1) << 0xe |
                         (ushort)(auVar75[0xf] >> 7) << 0xf;
                uVar30 = (uint)uVar16;
                if ((bVar8 & 0xf) != 0) {
                  uVar30 = (uint)uVar16 << (0x10 - (bVar8 & 0xf) & 0x1f) & 0xfffe |
                           (uint)(uVar16 >> (bVar8 & 0xf));
                }
                if (uVar30 == 0) {
                  uVar46 = 0;
                }
                else {
                  uVar46 = 0;
                  while( true ) {
                    iVar43 = iVar43 + -1;
                    iVar15 = 0;
                    if (uVar30 != 0) {
                      for (; (uVar30 >> iVar15 & 1) == 0; iVar15 = iVar15 + 1) {
                      }
                    }
                    if (pUVar12[uVar24 + (iVar15 + (uint)bVar8 & 0xf)] < uVar21) break;
                    auStack_b8[uVar46] = pUVar12[uVar24 + (iVar15 + (uint)bVar8 & 0xf)];
                    uVar46 = uVar46 + 1;
                    uVar30 = uVar30 & uVar30 - 1;
                    if ((uVar30 == 0) || (iVar43 == 0)) break;
                  }
                }
                uVar30 = bVar8 - 1 & 0xf;
                *(char *)(pUVar13 + uVar24) = (char)uVar30;
                *(undefined1 *)((long)(pUVar13 + uVar24) + (ulong)uVar30 + 1) = auVar74[0];
                UVar48 = ms->nextToUpdate;
                ms->nextToUpdate = UVar48 + 1;
                pUVar12[uVar24 + uVar30] = UVar48;
                if (uVar46 == 0) goto LAB_006f1dc3;
                uVar24 = 999999999;
                uVar50 = 0;
                pBVar37 = (BYTE *)0x3;
                do {
                  uVar30 = auStack_b8[uVar50];
                  if (uVar30 < uVar47) {
                    if (*(int *)(pBVar49 + uVar30) == *(int *)puVar40) {
                      sVar23 = ZSTD_count_2segments
                                         ((BYTE *)((long)puVar35 + 5),pBVar49 + (ulong)uVar30 + 4,
                                          (BYTE *)iEnd,pBVar49 + uVar47,pBVar33 + uVar47);
                      pBVar27 = (BYTE *)(sVar23 + 4);
                    }
                    else {
LAB_006f198d:
                      pBVar27 = (BYTE *)0x0;
                    }
                  }
                  else {
                    puVar32 = (ulong *)(pBVar33 + uVar30);
                    if (pBVar37[(long)puVar32] != *(BYTE *)((long)puVar40 + (long)pBVar37))
                    goto LAB_006f198d;
                    puVar36 = puVar40;
                    if (puVar40 < puVar1) {
                      uVar28 = *puVar40 ^ *puVar32;
                      uVar26 = 0;
                      if (uVar28 != 0) {
                        for (; (uVar28 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                        }
                      }
                      pBVar27 = (BYTE *)(uVar26 >> 3 & 0x1fffffff);
                      puVar36 = (ulong *)((long)puVar35 + 9);
                      if (*puVar32 == *puVar40) {
                        do {
                          puVar32 = puVar32 + 1;
                          if (puVar1 <= puVar36) goto LAB_006f199a;
                          uVar26 = *puVar36;
                          uVar44 = uVar26 ^ *puVar32;
                          uVar28 = 0;
                          if (uVar44 != 0) {
                            for (; (uVar44 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                            }
                          }
                          pBVar27 = (BYTE *)((long)puVar36 +
                                            ((uVar28 >> 3 & 0x1fffffff) - (long)puVar40));
                          puVar36 = puVar36 + 1;
                        } while (*puVar32 == uVar26);
                      }
                    }
                    else {
LAB_006f199a:
                      if ((puVar36 < puVar2) && ((int)*puVar32 == (int)*puVar36)) {
                        puVar36 = (ulong *)((long)puVar36 + 4);
                        puVar32 = (ulong *)((long)puVar32 + 4);
                      }
                      if ((puVar36 < puVar3) && ((short)*puVar32 == (short)*puVar36)) {
                        puVar36 = (ulong *)((long)puVar36 + 2);
                        puVar32 = (ulong *)((long)puVar32 + 2);
                      }
                      if (puVar36 < iEnd) {
                        puVar36 = (ulong *)((long)puVar36 +
                                           (ulong)((BYTE)*puVar32 == (BYTE)*puVar36));
                      }
                      pBVar27 = (BYTE *)((long)puVar36 - (long)puVar40);
                    }
                  }
                  pBVar25 = pBVar37;
                  if (pBVar37 < pBVar27) {
                    pBVar25 = pBVar27;
                    uVar24 = (ulong)((uVar45 + 2) - uVar30);
                  }
                } while ((pBVar27 <= pBVar37 || (ulong *)((long)puVar40 + (long)pBVar27) != iEnd) &&
                        (uVar50 = uVar50 + 1, pBVar37 = pBVar25, uVar50 < uVar46));
              }
              else {
                pUVar12 = ms->hashTable;
                pUVar13 = ms->tagTable;
                pBVar33 = (ms->window).base;
                uVar24 = (long)puVar40 - (long)pBVar33;
                uVar34 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
                uVar30 = (ms->window).lowLimit;
                uVar45 = (uint)uVar24;
                uVar21 = uVar45 - uVar34;
                if (uVar45 - uVar30 <= uVar34) {
                  uVar21 = uVar30;
                }
                if (ms->loadedDictEnd != 0) {
                  uVar21 = uVar30;
                }
                if (3 < uVar47) {
                  uVar47 = 4;
                }
                iVar43 = 1 << ((byte)uVar47 & 0x1f);
                pBVar49 = (ms->window).dictBase;
                uVar47 = (ms->window).dictLimit;
                uVar46 = (ulong)ms->nextToUpdate;
                local_1b0 = (char)ms->rowHashLog;
                if (ms->nextToUpdate < uVar45) {
                  do {
                    uVar34 = (uint)uVar46 & 7;
                    uVar30 = ms->hashCache[uVar34];
                    ms->hashCache[uVar34] =
                         (uint)(*(int *)(pBVar33 + uVar46 + 8) * -0x61c8864f) >>
                         (0x18U - local_1b0 & 0x1f);
                    uVar50 = (ulong)(uVar30 >> 4 & 0xfffffff0);
                    uVar34 = (byte)((char)pUVar13[uVar50] - 1) & 0xf;
                    *(char *)(pUVar13 + uVar50) = (char)uVar34;
                    *(char *)((long)pUVar13 + (ulong)uVar34 + 1 + uVar50 * 2) = (char)uVar30;
                    pUVar12[uVar50 + uVar34] = (uint)uVar46;
                    uVar46 = uVar46 + 1;
                  } while ((uVar24 & 0xffffffff) != uVar46);
                }
                ms->nextToUpdate = uVar45;
                uVar30 = ms->hashCache[uVar45 & 7];
                ms->hashCache[uVar45 & 7] =
                     (uint)(*(int *)(pBVar33 + (uVar24 & 0xffffffff) + 8) * -0x61c8864f) >>
                     (0x18U - local_1b0 & 0x1f);
                uVar24 = (ulong)(uVar30 >> 4 & 0xfffffff0);
                bVar8 = (byte)pUVar13[uVar24];
                pcVar6 = (char *)((long)pUVar13 + uVar24 * 2 + 1);
                uVar92 = (undefined1)(uVar30 >> 0x18);
                uVar90 = (undefined1)(uVar30 >> 0x10);
                uVar88 = (undefined1)(uVar30 >> 8);
                auVar77._4_4_ =
                     (int)(CONCAT35(CONCAT21(CONCAT11(uVar92,uVar92),uVar90),CONCAT14(uVar90,uVar30)
                                   ) >> 0x20);
                auVar77[3] = uVar88;
                auVar77[2] = uVar88;
                auVar77[0] = (undefined1)uVar30;
                auVar77[1] = auVar77[0];
                auVar77._8_8_ = 0;
                auVar95 = pshuflw(auVar77,auVar77,0);
                cVar61 = auVar95[0];
                auVar78[0] = -(cVar61 == *pcVar6);
                cVar89 = auVar95[1];
                auVar78[1] = -(cVar89 == pcVar6[1]);
                cVar91 = auVar95[2];
                auVar78[2] = -(cVar91 == pcVar6[2]);
                cVar93 = auVar95[3];
                auVar78[3] = -(cVar93 == pcVar6[3]);
                auVar78[4] = -(cVar61 == pcVar6[4]);
                auVar78[5] = -(cVar89 == pcVar6[5]);
                auVar78[6] = -(cVar91 == pcVar6[6]);
                auVar78[7] = -(cVar93 == pcVar6[7]);
                auVar78[8] = -(cVar61 == pcVar6[8]);
                auVar78[9] = -(cVar89 == pcVar6[9]);
                auVar78[10] = -(cVar91 == pcVar6[10]);
                auVar78[0xb] = -(cVar93 == pcVar6[0xb]);
                auVar78[0xc] = -(cVar61 == pcVar6[0xc]);
                auVar78[0xd] = -(cVar89 == pcVar6[0xd]);
                auVar78[0xe] = -(cVar91 == pcVar6[0xe]);
                auVar78[0xf] = -(cVar93 == pcVar6[0xf]);
                uVar16 = (ushort)(SUB161(auVar78 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar78 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar78 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar78 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar78 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar78 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar78 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar78 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar78 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar78 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar78 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar78 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar78 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar78 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar78 >> 0x77,0) & 1) << 0xe |
                         (ushort)(auVar78[0xf] >> 7) << 0xf;
                uVar30 = (uint)uVar16;
                if ((bVar8 & 0xf) != 0) {
                  uVar30 = (uint)uVar16 << (0x10 - (bVar8 & 0xf) & 0x1f) & 0xfffe |
                           (uint)(uVar16 >> (bVar8 & 0xf));
                }
                if (uVar30 == 0) {
                  uVar46 = 0;
                }
                else {
                  uVar46 = 0;
                  while( true ) {
                    iVar43 = iVar43 + -1;
                    iVar15 = 0;
                    if (uVar30 != 0) {
                      for (; (uVar30 >> iVar15 & 1) == 0; iVar15 = iVar15 + 1) {
                      }
                    }
                    if (pUVar12[uVar24 + (iVar15 + (uint)bVar8 & 0xf)] < uVar21) break;
                    auStack_b8[uVar46] = pUVar12[uVar24 + (iVar15 + (uint)bVar8 & 0xf)];
                    uVar46 = uVar46 + 1;
                    uVar30 = uVar30 & uVar30 - 1;
                    if ((uVar30 == 0) || (iVar43 == 0)) break;
                  }
                }
                uVar30 = bVar8 - 1 & 0xf;
                *(char *)(pUVar13 + uVar24) = (char)uVar30;
                *(undefined1 *)((long)(pUVar13 + uVar24) + (ulong)uVar30 + 1) = auVar77[0];
                UVar48 = ms->nextToUpdate;
                ms->nextToUpdate = UVar48 + 1;
                pUVar12[uVar24 + uVar30] = UVar48;
                if (uVar46 == 0) goto LAB_006f1dc3;
                uVar24 = 999999999;
                uVar50 = 0;
                pBVar37 = (BYTE *)0x3;
                do {
                  uVar30 = auStack_b8[uVar50];
                  if (uVar30 < uVar47) {
                    if (*(int *)(pBVar49 + uVar30) == *(int *)puVar40) {
                      sVar23 = ZSTD_count_2segments
                                         ((BYTE *)((long)puVar35 + 5),pBVar49 + (ulong)uVar30 + 4,
                                          (BYTE *)iEnd,pBVar49 + uVar47,pBVar33 + uVar47);
                      pBVar27 = (BYTE *)(sVar23 + 4);
                    }
                    else {
LAB_006f1d3d:
                      pBVar27 = (BYTE *)0x0;
                    }
                  }
                  else {
                    puVar32 = (ulong *)(pBVar33 + uVar30);
                    if (pBVar37[(long)puVar32] != *(BYTE *)((long)puVar40 + (long)pBVar37))
                    goto LAB_006f1d3d;
                    puVar36 = puVar40;
                    if (puVar40 < puVar1) {
                      uVar28 = *puVar40 ^ *puVar32;
                      uVar26 = 0;
                      if (uVar28 != 0) {
                        for (; (uVar28 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                        }
                      }
                      pBVar27 = (BYTE *)(uVar26 >> 3 & 0x1fffffff);
                      puVar36 = (ulong *)((long)puVar35 + 9);
                      if (*puVar32 == *puVar40) {
                        do {
                          puVar32 = puVar32 + 1;
                          if (puVar1 <= puVar36) goto LAB_006f1d4a;
                          uVar26 = *puVar36;
                          uVar44 = uVar26 ^ *puVar32;
                          uVar28 = 0;
                          if (uVar44 != 0) {
                            for (; (uVar44 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                            }
                          }
                          pBVar27 = (BYTE *)((long)puVar36 +
                                            ((uVar28 >> 3 & 0x1fffffff) - (long)puVar40));
                          puVar36 = puVar36 + 1;
                        } while (*puVar32 == uVar26);
                      }
                    }
                    else {
LAB_006f1d4a:
                      if ((puVar36 < puVar2) && ((int)*puVar32 == (int)*puVar36)) {
                        puVar36 = (ulong *)((long)puVar36 + 4);
                        puVar32 = (ulong *)((long)puVar32 + 4);
                      }
                      if ((puVar36 < puVar3) && ((short)*puVar32 == (short)*puVar36)) {
                        puVar36 = (ulong *)((long)puVar36 + 2);
                        puVar32 = (ulong *)((long)puVar32 + 2);
                      }
                      if (puVar36 < iEnd) {
                        puVar36 = (ulong *)((long)puVar36 +
                                           (ulong)((BYTE)*puVar32 == (BYTE)*puVar36));
                      }
                      pBVar27 = (BYTE *)((long)puVar36 - (long)puVar40);
                    }
                  }
                  pBVar25 = pBVar37;
                  if (pBVar37 < pBVar27) {
                    pBVar25 = pBVar27;
                    uVar24 = (ulong)((uVar45 + 2) - uVar30);
                  }
                } while ((pBVar27 <= pBVar37 || (ulong *)((long)puVar40 + (long)pBVar27) != iEnd) &&
                        (uVar50 = uVar50 + 1, pBVar37 = pBVar25, uVar50 < uVar46));
              }
            }
            else if (uVar30 - 6 < 2) {
              pUVar12 = ms->hashTable;
              pUVar13 = ms->tagTable;
              pBVar33 = (ms->window).base;
              uVar24 = (long)puVar40 - (long)pBVar33;
              uVar45 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
              uVar47 = (ms->window).lowLimit;
              uVar21 = (uint)uVar24;
              uVar30 = uVar21 - uVar45;
              if (uVar21 - uVar47 <= uVar45) {
                uVar30 = uVar47;
              }
              pBVar49 = (ms->window).dictBase;
              uVar45 = (ms->window).dictLimit;
              if (ms->loadedDictEnd != 0) {
                uVar30 = uVar47;
              }
              uVar46 = (ulong)ms->nextToUpdate;
              local_198 = (char)ms->rowHashLog;
              if (ms->nextToUpdate < uVar21) {
                do {
                  uVar34 = (uint)uVar46 & 7;
                  uVar47 = ms->hashCache[uVar34];
                  ms->hashCache[uVar34] =
                       (U32)((ulong)(*(long *)(pBVar33 + uVar46 + 8) * -0x30e4432340650000) >>
                            (0x38U - local_198 & 0x3f));
                  uVar50 = (ulong)(uVar47 >> 3 & 0xffffffe0);
                  uVar34 = (byte)((char)pUVar13[uVar50] - 1) & 0x1f;
                  *(char *)(pUVar13 + uVar50) = (char)uVar34;
                  *(char *)((long)pUVar13 + (ulong)uVar34 + 1 + uVar50 * 2) = (char)uVar47;
                  pUVar12[uVar50 + uVar34] = (uint)uVar46;
                  uVar46 = uVar46 + 1;
                } while ((uVar24 & 0xffffffff) != uVar46);
              }
              ms->nextToUpdate = uVar21;
              uVar47 = ms->hashCache[uVar21 & 7];
              ms->hashCache[uVar21 & 7] =
                   (U32)((ulong)(*(long *)(pBVar33 + (uVar24 & 0xffffffff) + 8) *
                                -0x30e4432340650000) >> (0x38U - local_198 & 0x3f));
              uVar24 = (ulong)(uVar47 >> 3 & 0xffffffe0);
              bVar8 = (byte)pUVar13[uVar24];
              pcVar6 = (char *)((long)pUVar13 + uVar24 * 2 + 1);
              pcVar7 = (char *)((long)pUVar13 + uVar24 * 2 + 0x11);
              uVar92 = (undefined1)(uVar47 >> 0x18);
              uVar90 = (undefined1)(uVar47 >> 0x10);
              uVar88 = (undefined1)(uVar47 >> 8);
              auVar98._4_4_ =
                   (int)(CONCAT35(CONCAT21(CONCAT11(uVar92,uVar92),uVar90),CONCAT14(uVar90,uVar47))
                        >> 0x20);
              auVar98[3] = uVar88;
              auVar98[2] = uVar88;
              auVar98[0] = (undefined1)uVar47;
              auVar98[1] = auVar98[0];
              auVar98._8_8_ = 0;
              auVar95 = pshuflw(auVar98,auVar98,0);
              cVar61 = auVar95[0];
              auVar55[0] = -(*pcVar6 == cVar61);
              cVar89 = auVar95[1];
              auVar55[1] = -(pcVar6[1] == cVar89);
              cVar91 = auVar95[2];
              auVar55[2] = -(pcVar6[2] == cVar91);
              cVar93 = auVar95[3];
              auVar55[3] = -(pcVar6[3] == cVar93);
              auVar55[4] = -(pcVar6[4] == cVar61);
              auVar55[5] = -(pcVar6[5] == cVar89);
              auVar55[6] = -(pcVar6[6] == cVar91);
              auVar55[7] = -(pcVar6[7] == cVar93);
              auVar55[8] = -(pcVar6[8] == cVar61);
              auVar55[9] = -(pcVar6[9] == cVar89);
              auVar55[10] = -(pcVar6[10] == cVar91);
              auVar55[0xb] = -(pcVar6[0xb] == cVar93);
              auVar55[0xc] = -(pcVar6[0xc] == cVar61);
              auVar55[0xd] = -(pcVar6[0xd] == cVar89);
              auVar55[0xe] = -(pcVar6[0xe] == cVar91);
              auVar55[0xf] = -(pcVar6[0xf] == cVar93);
              auVar70[0] = -(*pcVar7 == cVar61);
              auVar70[1] = -(pcVar7[1] == cVar89);
              auVar70[2] = -(pcVar7[2] == cVar91);
              auVar70[3] = -(pcVar7[3] == cVar93);
              auVar70[4] = -(pcVar7[4] == cVar61);
              auVar70[5] = -(pcVar7[5] == cVar89);
              auVar70[6] = -(pcVar7[6] == cVar91);
              auVar70[7] = -(pcVar7[7] == cVar93);
              auVar70[8] = -(pcVar7[8] == cVar61);
              auVar70[9] = -(pcVar7[9] == cVar89);
              auVar70[10] = -(pcVar7[10] == cVar91);
              auVar70[0xb] = -(pcVar7[0xb] == cVar93);
              auVar70[0xc] = -(pcVar7[0xc] == cVar61);
              auVar70[0xd] = -(pcVar7[0xd] == cVar89);
              auVar70[0xe] = -(pcVar7[0xe] == cVar91);
              auVar70[0xf] = -(pcVar7[0xf] == cVar93);
              uVar34 = CONCAT22((ushort)(SUB161(auVar70 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar70 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar70 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar70 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar70 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar70 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar70 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar70 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar70 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar70 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar70 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar70 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar70 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar70 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar70 >> 0x77,0) & 1) << 0xe |
                                (ushort)(auVar70[0xf] >> 7) << 0xf,
                                (ushort)(SUB161(auVar55 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar55 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar55 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar55 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar55 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar55 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar55 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar55 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar55 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar55 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar55 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar55 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar55 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar55 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar55 >> 0x77,0) & 1) << 0xe |
                                (ushort)(auVar55[0xf] >> 7) << 0xf);
              uVar47 = uVar34 >> (bVar8 & 0x1f) | uVar34 << 0x20 - (bVar8 & 0x1f);
              if ((bVar8 & 0x1f) == 0) {
                uVar47 = uVar34;
              }
              if (uVar47 == 0) {
                uVar46 = 0;
              }
              else {
                uVar46 = 0;
                iVar43 = -0x1f;
                while( true ) {
                  iVar15 = 0;
                  if (uVar47 != 0) {
                    for (; (uVar47 >> iVar15 & 1) == 0; iVar15 = iVar15 + 1) {
                    }
                  }
                  if (pUVar12[uVar24 + (iVar15 + (uint)bVar8 & 0x1f)] < uVar30) break;
                  auStack_b8[uVar46] = pUVar12[uVar24 + (iVar15 + (uint)bVar8 & 0x1f)];
                  uVar46 = uVar46 + 1;
                  uVar47 = uVar47 & uVar47 - 1;
                  if ((uVar47 == 0) || (bVar51 = iVar43 == 0, iVar43 = iVar43 + 1, bVar51)) break;
                }
              }
              uVar47 = bVar8 - 1 & 0x1f;
              *(char *)(pUVar13 + uVar24) = (char)uVar47;
              *(undefined1 *)((long)(pUVar13 + uVar24) + (ulong)uVar47 + 1) = auVar98[0];
              UVar48 = ms->nextToUpdate;
              ms->nextToUpdate = UVar48 + 1;
              pUVar12[uVar24 + uVar47] = UVar48;
              if (uVar46 == 0) goto LAB_006f1dc3;
              uVar24 = 999999999;
              uVar50 = 0;
              pBVar37 = (BYTE *)0x3;
              do {
                uVar47 = auStack_b8[uVar50];
                if (uVar47 < uVar45) {
                  if (*(int *)(pBVar49 + uVar47) == *(int *)puVar40) {
                    sVar23 = ZSTD_count_2segments
                                       ((BYTE *)((long)puVar35 + 5),pBVar49 + (ulong)uVar47 + 4,
                                        (BYTE *)iEnd,pBVar49 + uVar45,pBVar33 + uVar45);
                    pBVar27 = (BYTE *)(sVar23 + 4);
                  }
                  else {
LAB_006f13f3:
                    pBVar27 = (BYTE *)0x0;
                  }
                }
                else {
                  puVar32 = (ulong *)(pBVar33 + uVar47);
                  if (pBVar37[(long)puVar32] != *(BYTE *)((long)puVar40 + (long)pBVar37))
                  goto LAB_006f13f3;
                  puVar36 = puVar40;
                  if (puVar40 < puVar1) {
                    uVar28 = *puVar40 ^ *puVar32;
                    uVar26 = 0;
                    if (uVar28 != 0) {
                      for (; (uVar28 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                      }
                    }
                    pBVar27 = (BYTE *)(uVar26 >> 3 & 0x1fffffff);
                    puVar36 = (ulong *)((long)puVar35 + 9);
                    if (*puVar32 == *puVar40) {
                      do {
                        puVar32 = puVar32 + 1;
                        if (puVar1 <= puVar36) goto LAB_006f1400;
                        uVar26 = *puVar36;
                        uVar44 = uVar26 ^ *puVar32;
                        uVar28 = 0;
                        if (uVar44 != 0) {
                          for (; (uVar44 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                          }
                        }
                        pBVar27 = (BYTE *)((long)puVar36 +
                                          ((uVar28 >> 3 & 0x1fffffff) - (long)puVar40));
                        puVar36 = puVar36 + 1;
                      } while (*puVar32 == uVar26);
                    }
                  }
                  else {
LAB_006f1400:
                    if ((puVar36 < puVar2) && ((int)*puVar32 == (int)*puVar36)) {
                      puVar36 = (ulong *)((long)puVar36 + 4);
                      puVar32 = (ulong *)((long)puVar32 + 4);
                    }
                    if ((puVar36 < puVar3) && ((short)*puVar32 == (short)*puVar36)) {
                      puVar36 = (ulong *)((long)puVar36 + 2);
                      puVar32 = (ulong *)((long)puVar32 + 2);
                    }
                    if (puVar36 < iEnd) {
                      puVar36 = (ulong *)((long)puVar36 + (ulong)((BYTE)*puVar32 == (BYTE)*puVar36))
                      ;
                    }
                    pBVar27 = (BYTE *)((long)puVar36 - (long)puVar40);
                  }
                }
                pBVar25 = pBVar37;
                if (pBVar37 < pBVar27) {
                  pBVar25 = pBVar27;
                  uVar24 = (ulong)((uVar21 + 2) - uVar47);
                }
              } while ((pBVar27 <= pBVar37 || (ulong *)((long)puVar40 + (long)pBVar27) != iEnd) &&
                      (uVar50 = uVar50 + 1, pBVar37 = pBVar25, uVar50 < uVar46));
            }
            else if (uVar30 == 5) {
              pUVar12 = ms->hashTable;
              pUVar13 = ms->tagTable;
              pBVar33 = (ms->window).base;
              uVar24 = (long)puVar40 - (long)pBVar33;
              uVar45 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
              uVar47 = (ms->window).lowLimit;
              uVar21 = (uint)uVar24;
              uVar30 = uVar21 - uVar45;
              if (uVar21 - uVar47 <= uVar45) {
                uVar30 = uVar47;
              }
              pBVar49 = (ms->window).dictBase;
              uVar45 = (ms->window).dictLimit;
              if (ms->loadedDictEnd != 0) {
                uVar30 = uVar47;
              }
              uVar46 = (ulong)ms->nextToUpdate;
              local_198 = (char)ms->rowHashLog;
              if (ms->nextToUpdate < uVar21) {
                do {
                  uVar34 = (uint)uVar46 & 7;
                  uVar47 = ms->hashCache[uVar34];
                  ms->hashCache[uVar34] =
                       (U32)((ulong)(*(long *)(pBVar33 + uVar46 + 8) * -0x30e4432345000000) >>
                            (0x38U - local_198 & 0x3f));
                  uVar50 = (ulong)(uVar47 >> 3 & 0xffffffe0);
                  uVar34 = (byte)((char)pUVar13[uVar50] - 1) & 0x1f;
                  *(char *)(pUVar13 + uVar50) = (char)uVar34;
                  *(char *)((long)pUVar13 + (ulong)uVar34 + 1 + uVar50 * 2) = (char)uVar47;
                  pUVar12[uVar50 + uVar34] = (uint)uVar46;
                  uVar46 = uVar46 + 1;
                } while ((uVar24 & 0xffffffff) != uVar46);
              }
              ms->nextToUpdate = uVar21;
              uVar47 = ms->hashCache[uVar21 & 7];
              ms->hashCache[uVar21 & 7] =
                   (U32)((ulong)(*(long *)(pBVar33 + (uVar24 & 0xffffffff) + 8) *
                                -0x30e4432345000000) >> (0x38U - local_198 & 0x3f));
              uVar24 = (ulong)(uVar47 >> 3 & 0xffffffe0);
              bVar8 = (byte)pUVar13[uVar24];
              pcVar6 = (char *)((long)pUVar13 + uVar24 * 2 + 1);
              pcVar7 = (char *)((long)pUVar13 + uVar24 * 2 + 0x11);
              uVar92 = (undefined1)(uVar47 >> 0x18);
              uVar90 = (undefined1)(uVar47 >> 0x10);
              uVar88 = (undefined1)(uVar47 >> 8);
              auVar99._4_4_ =
                   (int)(CONCAT35(CONCAT21(CONCAT11(uVar92,uVar92),uVar90),CONCAT14(uVar90,uVar47))
                        >> 0x20);
              auVar99[3] = uVar88;
              auVar99[2] = uVar88;
              auVar99[0] = (undefined1)uVar47;
              auVar99[1] = auVar99[0];
              auVar99._8_8_ = 0;
              auVar95 = pshuflw(auVar99,auVar99,0);
              cVar61 = auVar95[0];
              auVar56[0] = -(*pcVar6 == cVar61);
              cVar89 = auVar95[1];
              auVar56[1] = -(pcVar6[1] == cVar89);
              cVar91 = auVar95[2];
              auVar56[2] = -(pcVar6[2] == cVar91);
              cVar93 = auVar95[3];
              auVar56[3] = -(pcVar6[3] == cVar93);
              auVar56[4] = -(pcVar6[4] == cVar61);
              auVar56[5] = -(pcVar6[5] == cVar89);
              auVar56[6] = -(pcVar6[6] == cVar91);
              auVar56[7] = -(pcVar6[7] == cVar93);
              auVar56[8] = -(pcVar6[8] == cVar61);
              auVar56[9] = -(pcVar6[9] == cVar89);
              auVar56[10] = -(pcVar6[10] == cVar91);
              auVar56[0xb] = -(pcVar6[0xb] == cVar93);
              auVar56[0xc] = -(pcVar6[0xc] == cVar61);
              auVar56[0xd] = -(pcVar6[0xd] == cVar89);
              auVar56[0xe] = -(pcVar6[0xe] == cVar91);
              auVar56[0xf] = -(pcVar6[0xf] == cVar93);
              auVar73[0] = -(*pcVar7 == cVar61);
              auVar73[1] = -(pcVar7[1] == cVar89);
              auVar73[2] = -(pcVar7[2] == cVar91);
              auVar73[3] = -(pcVar7[3] == cVar93);
              auVar73[4] = -(pcVar7[4] == cVar61);
              auVar73[5] = -(pcVar7[5] == cVar89);
              auVar73[6] = -(pcVar7[6] == cVar91);
              auVar73[7] = -(pcVar7[7] == cVar93);
              auVar73[8] = -(pcVar7[8] == cVar61);
              auVar73[9] = -(pcVar7[9] == cVar89);
              auVar73[10] = -(pcVar7[10] == cVar91);
              auVar73[0xb] = -(pcVar7[0xb] == cVar93);
              auVar73[0xc] = -(pcVar7[0xc] == cVar61);
              auVar73[0xd] = -(pcVar7[0xd] == cVar89);
              auVar73[0xe] = -(pcVar7[0xe] == cVar91);
              auVar73[0xf] = -(pcVar7[0xf] == cVar93);
              uVar34 = CONCAT22((ushort)(SUB161(auVar73 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar73 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar73 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar73 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar73 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar73 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar73 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar73 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar73 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar73 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar73 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar73 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar73 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar73 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar73 >> 0x77,0) & 1) << 0xe |
                                (ushort)(auVar73[0xf] >> 7) << 0xf,
                                (ushort)(SUB161(auVar56 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar56 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar56 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar56 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar56 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar56 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar56 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar56 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar56 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar56 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar56 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar56 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar56 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar56 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar56 >> 0x77,0) & 1) << 0xe |
                                (ushort)(auVar56[0xf] >> 7) << 0xf);
              uVar47 = uVar34 >> (bVar8 & 0x1f) | uVar34 << 0x20 - (bVar8 & 0x1f);
              if ((bVar8 & 0x1f) == 0) {
                uVar47 = uVar34;
              }
              if (uVar47 == 0) {
                uVar46 = 0;
              }
              else {
                uVar46 = 0;
                iVar43 = -0x1f;
                while( true ) {
                  iVar15 = 0;
                  if (uVar47 != 0) {
                    for (; (uVar47 >> iVar15 & 1) == 0; iVar15 = iVar15 + 1) {
                    }
                  }
                  if (pUVar12[uVar24 + (iVar15 + (uint)bVar8 & 0x1f)] < uVar30) break;
                  auStack_b8[uVar46] = pUVar12[uVar24 + (iVar15 + (uint)bVar8 & 0x1f)];
                  uVar46 = uVar46 + 1;
                  uVar47 = uVar47 & uVar47 - 1;
                  if ((uVar47 == 0) || (bVar51 = iVar43 == 0, iVar43 = iVar43 + 1, bVar51)) break;
                }
              }
              uVar47 = bVar8 - 1 & 0x1f;
              *(char *)(pUVar13 + uVar24) = (char)uVar47;
              *(undefined1 *)((long)(pUVar13 + uVar24) + (ulong)uVar47 + 1) = auVar99[0];
              UVar48 = ms->nextToUpdate;
              ms->nextToUpdate = UVar48 + 1;
              pUVar12[uVar24 + uVar47] = UVar48;
              if (uVar46 == 0) {
LAB_006f1dc3:
                pBVar25 = (BYTE *)0x3;
                uVar24 = 999999999;
              }
              else {
                uVar24 = 999999999;
                uVar50 = 0;
                pBVar37 = (BYTE *)0x3;
                do {
                  uVar47 = auStack_b8[uVar50];
                  if (uVar47 < uVar45) {
                    if (*(int *)(pBVar49 + uVar47) == *(int *)puVar40) {
                      sVar23 = ZSTD_count_2segments
                                         ((BYTE *)((long)puVar35 + 5),pBVar49 + (ulong)uVar47 + 4,
                                          (BYTE *)iEnd,pBVar49 + uVar45,pBVar33 + uVar45);
                      pBVar27 = (BYTE *)(sVar23 + 4);
                    }
                    else {
LAB_006f17b5:
                      pBVar27 = (BYTE *)0x0;
                    }
                  }
                  else {
                    puVar32 = (ulong *)(pBVar33 + uVar47);
                    if (pBVar37[(long)puVar32] != *(BYTE *)((long)puVar40 + (long)pBVar37))
                    goto LAB_006f17b5;
                    puVar36 = puVar40;
                    if (puVar40 < puVar1) {
                      uVar28 = *puVar40 ^ *puVar32;
                      uVar26 = 0;
                      if (uVar28 != 0) {
                        for (; (uVar28 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                        }
                      }
                      pBVar27 = (BYTE *)(uVar26 >> 3 & 0x1fffffff);
                      puVar36 = (ulong *)((long)puVar35 + 9);
                      if (*puVar32 == *puVar40) {
                        do {
                          puVar32 = puVar32 + 1;
                          if (puVar1 <= puVar36) goto LAB_006f17c2;
                          uVar26 = *puVar36;
                          uVar44 = uVar26 ^ *puVar32;
                          uVar28 = 0;
                          if (uVar44 != 0) {
                            for (; (uVar44 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                            }
                          }
                          pBVar27 = (BYTE *)((long)puVar36 +
                                            ((uVar28 >> 3 & 0x1fffffff) - (long)puVar40));
                          puVar36 = puVar36 + 1;
                        } while (*puVar32 == uVar26);
                      }
                    }
                    else {
LAB_006f17c2:
                      if ((puVar36 < puVar2) && ((int)*puVar32 == (int)*puVar36)) {
                        puVar36 = (ulong *)((long)puVar36 + 4);
                        puVar32 = (ulong *)((long)puVar32 + 4);
                      }
                      if ((puVar36 < puVar3) && ((short)*puVar32 == (short)*puVar36)) {
                        puVar36 = (ulong *)((long)puVar36 + 2);
                        puVar32 = (ulong *)((long)puVar32 + 2);
                      }
                      if (puVar36 < iEnd) {
                        puVar36 = (ulong *)((long)puVar36 +
                                           (ulong)((BYTE)*puVar32 == (BYTE)*puVar36));
                      }
                      pBVar27 = (BYTE *)((long)puVar36 - (long)puVar40);
                    }
                  }
                  pBVar25 = pBVar37;
                  if (pBVar37 < pBVar27) {
                    pBVar25 = pBVar27;
                    uVar24 = (ulong)((uVar21 + 2) - uVar47);
                  }
                } while ((pBVar27 <= pBVar37 || (ulong *)((long)puVar40 + (long)pBVar27) != iEnd) &&
                        (uVar50 = uVar50 + 1, pBVar37 = pBVar25, uVar50 < uVar46));
              }
            }
            else {
              pUVar12 = ms->hashTable;
              pUVar13 = ms->tagTable;
              pBVar33 = (ms->window).base;
              uVar24 = (long)puVar40 - (long)pBVar33;
              uVar45 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
              uVar47 = (ms->window).lowLimit;
              uVar21 = (uint)uVar24;
              uVar30 = uVar21 - uVar45;
              if (uVar21 - uVar47 <= uVar45) {
                uVar30 = uVar47;
              }
              pBVar49 = (ms->window).dictBase;
              uVar45 = (ms->window).dictLimit;
              if (ms->loadedDictEnd != 0) {
                uVar30 = uVar47;
              }
              uVar46 = (ulong)ms->nextToUpdate;
              cVar61 = (char)ms->rowHashLog;
              if (ms->nextToUpdate < uVar21) {
                do {
                  uVar34 = (uint)uVar46 & 7;
                  uVar47 = ms->hashCache[uVar34];
                  ms->hashCache[uVar34] =
                       (uint)(*(int *)(pBVar33 + uVar46 + 8) * -0x61c8864f) >>
                       (0x18U - cVar61 & 0x1f);
                  uVar50 = (ulong)(uVar47 >> 3 & 0xffffffe0);
                  uVar34 = (byte)((char)pUVar13[uVar50] - 1) & 0x1f;
                  *(char *)(pUVar13 + uVar50) = (char)uVar34;
                  *(char *)((long)pUVar13 + (ulong)uVar34 + 1 + uVar50 * 2) = (char)uVar47;
                  pUVar12[uVar50 + uVar34] = (uint)uVar46;
                  uVar46 = uVar46 + 1;
                } while ((uVar24 & 0xffffffff) != uVar46);
              }
              ms->nextToUpdate = uVar21;
              uVar47 = ms->hashCache[uVar21 & 7];
              ms->hashCache[uVar21 & 7] =
                   (uint)(*(int *)(pBVar33 + (uVar24 & 0xffffffff) + 8) * -0x61c8864f) >>
                   (0x18U - cVar61 & 0x1f);
              uVar24 = (ulong)(uVar47 >> 3 & 0xffffffe0);
              bVar8 = (byte)pUVar13[uVar24];
              pcVar6 = (char *)((long)pUVar13 + uVar24 * 2 + 1);
              pcVar7 = (char *)((long)pUVar13 + uVar24 * 2 + 0x11);
              uVar92 = (undefined1)(uVar47 >> 0x18);
              uVar90 = (undefined1)(uVar47 >> 0x10);
              uVar88 = (undefined1)(uVar47 >> 8);
              auVar100._4_4_ =
                   (int)(CONCAT35(CONCAT21(CONCAT11(uVar92,uVar92),uVar90),CONCAT14(uVar90,uVar47))
                        >> 0x20);
              auVar100[3] = uVar88;
              auVar100[2] = uVar88;
              auVar100[0] = (undefined1)uVar47;
              auVar100[1] = auVar100[0];
              auVar100._8_8_ = 0;
              auVar95 = pshuflw(auVar100,auVar100,0);
              cVar61 = auVar95[0];
              auVar57[0] = -(*pcVar6 == cVar61);
              cVar89 = auVar95[1];
              auVar57[1] = -(pcVar6[1] == cVar89);
              cVar91 = auVar95[2];
              auVar57[2] = -(pcVar6[2] == cVar91);
              cVar93 = auVar95[3];
              auVar57[3] = -(pcVar6[3] == cVar93);
              auVar57[4] = -(pcVar6[4] == cVar61);
              auVar57[5] = -(pcVar6[5] == cVar89);
              auVar57[6] = -(pcVar6[6] == cVar91);
              auVar57[7] = -(pcVar6[7] == cVar93);
              auVar57[8] = -(pcVar6[8] == cVar61);
              auVar57[9] = -(pcVar6[9] == cVar89);
              auVar57[10] = -(pcVar6[10] == cVar91);
              auVar57[0xb] = -(pcVar6[0xb] == cVar93);
              auVar57[0xc] = -(pcVar6[0xc] == cVar61);
              auVar57[0xd] = -(pcVar6[0xd] == cVar89);
              auVar57[0xe] = -(pcVar6[0xe] == cVar91);
              auVar57[0xf] = -(pcVar6[0xf] == cVar93);
              auVar76[0] = -(*pcVar7 == cVar61);
              auVar76[1] = -(pcVar7[1] == cVar89);
              auVar76[2] = -(pcVar7[2] == cVar91);
              auVar76[3] = -(pcVar7[3] == cVar93);
              auVar76[4] = -(pcVar7[4] == cVar61);
              auVar76[5] = -(pcVar7[5] == cVar89);
              auVar76[6] = -(pcVar7[6] == cVar91);
              auVar76[7] = -(pcVar7[7] == cVar93);
              auVar76[8] = -(pcVar7[8] == cVar61);
              auVar76[9] = -(pcVar7[9] == cVar89);
              auVar76[10] = -(pcVar7[10] == cVar91);
              auVar76[0xb] = -(pcVar7[0xb] == cVar93);
              auVar76[0xc] = -(pcVar7[0xc] == cVar61);
              auVar76[0xd] = -(pcVar7[0xd] == cVar89);
              auVar76[0xe] = -(pcVar7[0xe] == cVar91);
              auVar76[0xf] = -(pcVar7[0xf] == cVar93);
              uVar34 = CONCAT22((ushort)(SUB161(auVar76 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar76 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar76 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar76 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar76 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar76 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar76 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar76 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar76 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar76 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar76 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar76 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar76 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar76 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar76 >> 0x77,0) & 1) << 0xe |
                                (ushort)(auVar76[0xf] >> 7) << 0xf,
                                (ushort)(SUB161(auVar57 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar57 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar57 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar57 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar57 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar57 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar57 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar57 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar57 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar57 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar57 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar57 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar57 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar57 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar57 >> 0x77,0) & 1) << 0xe |
                                (ushort)(auVar57[0xf] >> 7) << 0xf);
              uVar47 = uVar34 >> (bVar8 & 0x1f) | uVar34 << 0x20 - (bVar8 & 0x1f);
              if ((bVar8 & 0x1f) == 0) {
                uVar47 = uVar34;
              }
              if (uVar47 == 0) {
                uVar46 = 0;
              }
              else {
                uVar46 = 0;
                iVar43 = -0x1f;
                while( true ) {
                  iVar15 = 0;
                  if (uVar47 != 0) {
                    for (; (uVar47 >> iVar15 & 1) == 0; iVar15 = iVar15 + 1) {
                    }
                  }
                  if (pUVar12[uVar24 + (iVar15 + (uint)bVar8 & 0x1f)] < uVar30) break;
                  auStack_b8[uVar46] = pUVar12[uVar24 + (iVar15 + (uint)bVar8 & 0x1f)];
                  uVar46 = uVar46 + 1;
                  uVar47 = uVar47 & uVar47 - 1;
                  if ((uVar47 == 0) || (bVar51 = iVar43 == 0, iVar43 = iVar43 + 1, bVar51)) break;
                }
              }
              uVar47 = bVar8 - 1 & 0x1f;
              *(char *)(pUVar13 + uVar24) = (char)uVar47;
              *(undefined1 *)((long)(pUVar13 + uVar24) + (ulong)uVar47 + 1) = auVar100[0];
              UVar48 = ms->nextToUpdate;
              ms->nextToUpdate = UVar48 + 1;
              pUVar12[uVar24 + uVar47] = UVar48;
              if (uVar46 == 0) goto LAB_006f1dc3;
              uVar24 = 999999999;
              uVar50 = 0;
              pBVar37 = (BYTE *)0x3;
              do {
                uVar47 = auStack_b8[uVar50];
                if (uVar47 < uVar45) {
                  if (*(int *)(pBVar49 + uVar47) == *(int *)puVar40) {
                    sVar23 = ZSTD_count_2segments
                                       ((BYTE *)((long)puVar35 + 5),pBVar49 + (ulong)uVar47 + 4,
                                        (BYTE *)iEnd,pBVar49 + uVar45,pBVar33 + uVar45);
                    pBVar27 = (BYTE *)(sVar23 + 4);
                  }
                  else {
LAB_006f1b65:
                    pBVar27 = (BYTE *)0x0;
                  }
                }
                else {
                  puVar32 = (ulong *)(pBVar33 + uVar47);
                  if (pBVar37[(long)puVar32] != *(BYTE *)((long)puVar40 + (long)pBVar37))
                  goto LAB_006f1b65;
                  puVar36 = puVar40;
                  if (puVar40 < puVar1) {
                    uVar28 = *puVar40 ^ *puVar32;
                    uVar26 = 0;
                    if (uVar28 != 0) {
                      for (; (uVar28 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                      }
                    }
                    pBVar27 = (BYTE *)(uVar26 >> 3 & 0x1fffffff);
                    puVar36 = (ulong *)((long)puVar35 + 9);
                    if (*puVar32 == *puVar40) {
                      do {
                        puVar32 = puVar32 + 1;
                        if (puVar1 <= puVar36) goto LAB_006f1b72;
                        uVar26 = *puVar36;
                        uVar44 = uVar26 ^ *puVar32;
                        uVar28 = 0;
                        if (uVar44 != 0) {
                          for (; (uVar44 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                          }
                        }
                        pBVar27 = (BYTE *)((long)puVar36 +
                                          ((uVar28 >> 3 & 0x1fffffff) - (long)puVar40));
                        puVar36 = puVar36 + 1;
                      } while (*puVar32 == uVar26);
                    }
                  }
                  else {
LAB_006f1b72:
                    if ((puVar36 < puVar2) && ((int)*puVar32 == (int)*puVar36)) {
                      puVar36 = (ulong *)((long)puVar36 + 4);
                      puVar32 = (ulong *)((long)puVar32 + 4);
                    }
                    if ((puVar36 < puVar3) && ((short)*puVar32 == (short)*puVar36)) {
                      puVar36 = (ulong *)((long)puVar36 + 2);
                      puVar32 = (ulong *)((long)puVar32 + 2);
                    }
                    if (puVar36 < iEnd) {
                      puVar36 = (ulong *)((long)puVar36 + (ulong)((BYTE)*puVar32 == (BYTE)*puVar36))
                      ;
                    }
                    pBVar27 = (BYTE *)((long)puVar36 - (long)puVar40);
                  }
                }
                pBVar25 = pBVar37;
                if (pBVar37 < pBVar27) {
                  pBVar25 = pBVar27;
                  uVar24 = (ulong)((uVar21 + 2) - uVar47);
                }
              } while ((pBVar27 <= pBVar37 || (ulong *)((long)puVar40 + (long)pBVar27) != iEnd) &&
                      (uVar50 = uVar50 + 1, pBVar37 = pBVar25, uVar50 < uVar46));
            }
            bVar51 = true;
            if ((BYTE *)0x3 < pBVar25) {
              uVar30 = (int)local_178 + 1;
              uVar47 = 0x1f;
              if (uVar30 != 0) {
                for (; uVar30 >> uVar47 == 0; uVar47 = uVar47 - 1) {
                }
              }
              uVar30 = (int)uVar24 + 1;
              iVar43 = 0x1f;
              if (uVar30 != 0) {
                for (; uVar30 >> iVar43 == 0; iVar43 = iVar43 + -1) {
                }
              }
              if ((int)((uVar47 ^ 0x1f) + (int)local_160 * 4 + -0x1b) < (int)pBVar25 * 4 - iVar43) {
                bVar51 = false;
                puVar31 = puVar40;
                local_178 = uVar24;
                local_160 = pBVar25;
              }
            }
          } while (!bVar51);
          if (iLimit <= puVar40) break;
          puVar40 = (ulong *)((long)puVar35 + 2);
          iVar39 = iVar20 + 2;
          if (local_178 == 0) {
            local_178 = 0;
          }
          else {
            UVar48 = (ms->window).lowLimit;
            UVar29 = iVar39 - uVar18;
            if (iVar39 - UVar48 <= uVar18) {
              UVar29 = UVar48;
            }
            if (ms->loadedDictEnd != 0) {
              UVar29 = UVar48;
            }
            uVar47 = iVar39 - local_144;
            pBVar33 = base_00;
            if (uVar47 < uVar9) {
              pBVar33 = pBVar11;
            }
            if (((2 < iVar19 - uVar47) && (local_144 < iVar39 - UVar29)) &&
               (*(int *)puVar40 == *(int *)(pBVar33 + uVar47))) {
              puVar32 = iEnd;
              if (uVar47 < uVar9) {
                puVar32 = puVar22;
              }
              sVar23 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar35 + 6),(BYTE *)((long)(pBVar33 + uVar47) + 4)
                                  ,(BYTE *)iEnd,(BYTE *)puVar32,iStart);
              if (sVar23 < 0xfffffffffffffffc) {
                uVar30 = (int)local_178 + 1;
                uVar47 = 0x1f;
                if (uVar30 != 0) {
                  for (; uVar30 >> uVar47 == 0; uVar47 = uVar47 - 1) {
                  }
                }
                if ((int)((uVar47 ^ 0x1f) + (int)local_160 * 4 + -0x1e) <
                    (int)(BYTE *)(sVar23 + 4) * 4) {
                  local_178 = 0;
                  puVar31 = puVar40;
                  local_160 = (BYTE *)(sVar23 + 4);
                }
              }
            }
          }
          uVar47 = (ms->cParams).searchLog;
          uVar30 = (ms->cParams).minMatch;
          if (uVar47 < 5) {
            if (uVar30 - 6 < 2) {
              pUVar12 = ms->hashTable;
              pUVar13 = ms->tagTable;
              pBVar33 = (ms->window).base;
              uVar24 = (long)puVar40 - (long)pBVar33;
              uVar34 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
              uVar30 = (ms->window).lowLimit;
              uVar45 = (uint)uVar24;
              uVar21 = uVar45 - uVar34;
              if (uVar45 - uVar30 <= uVar34) {
                uVar21 = uVar30;
              }
              if (ms->loadedDictEnd != 0) {
                uVar21 = uVar30;
              }
              if (3 < uVar47) {
                uVar47 = 4;
              }
              iVar20 = 1 << ((byte)uVar47 & 0x1f);
              pBVar49 = (ms->window).dictBase;
              uVar47 = (ms->window).dictLimit;
              uVar46 = (ulong)ms->nextToUpdate;
              local_198 = (char)ms->rowHashLog;
              if (ms->nextToUpdate < uVar45) {
                do {
                  uVar34 = (uint)uVar46 & 7;
                  uVar30 = ms->hashCache[uVar34];
                  ms->hashCache[uVar34] =
                       (U32)((ulong)(*(long *)(pBVar33 + uVar46 + 8) * -0x30e4432340650000) >>
                            (0x38U - local_198 & 0x3f));
                  uVar50 = (ulong)(uVar30 >> 4 & 0xfffffff0);
                  uVar34 = (byte)((char)pUVar13[uVar50] - 1) & 0xf;
                  *(char *)(pUVar13 + uVar50) = (char)uVar34;
                  *(char *)((long)pUVar13 + (ulong)uVar34 + 1 + uVar50 * 2) = (char)uVar30;
                  pUVar12[uVar50 + uVar34] = (uint)uVar46;
                  uVar46 = uVar46 + 1;
                } while (uVar46 < (uVar24 & 0xffffffff));
              }
              ms->nextToUpdate = uVar45;
              uVar30 = ms->hashCache[uVar45 & 7];
              ms->hashCache[uVar45 & 7] =
                   (U32)((ulong)(*(long *)(pBVar33 + (uVar24 & 0xffffffff) + 8) *
                                -0x30e4432340650000) >> (0x38U - local_198 & 0x3f));
              uVar24 = (ulong)(uVar30 >> 4 & 0xfffffff0);
              bVar8 = (byte)pUVar13[uVar24];
              pcVar6 = (char *)((long)pUVar13 + uVar24 * 2 + 1);
              uVar92 = (undefined1)(uVar30 >> 0x18);
              uVar90 = (undefined1)(uVar30 >> 0x10);
              uVar88 = (undefined1)(uVar30 >> 8);
              auVar80._4_4_ =
                   (int)(CONCAT35(CONCAT21(CONCAT11(uVar92,uVar92),uVar90),CONCAT14(uVar90,uVar30))
                        >> 0x20);
              auVar80[3] = uVar88;
              auVar80[2] = uVar88;
              auVar80[0] = (undefined1)uVar30;
              auVar80[1] = auVar80[0];
              auVar80._8_8_ = 0;
              auVar95 = pshuflw(auVar80,auVar80,0);
              cVar61 = auVar95[0];
              auVar81[0] = -(cVar61 == *pcVar6);
              cVar89 = auVar95[1];
              auVar81[1] = -(cVar89 == pcVar6[1]);
              cVar91 = auVar95[2];
              auVar81[2] = -(cVar91 == pcVar6[2]);
              cVar93 = auVar95[3];
              auVar81[3] = -(cVar93 == pcVar6[3]);
              auVar81[4] = -(cVar61 == pcVar6[4]);
              auVar81[5] = -(cVar89 == pcVar6[5]);
              auVar81[6] = -(cVar91 == pcVar6[6]);
              auVar81[7] = -(cVar93 == pcVar6[7]);
              auVar81[8] = -(cVar61 == pcVar6[8]);
              auVar81[9] = -(cVar89 == pcVar6[9]);
              auVar81[10] = -(cVar91 == pcVar6[10]);
              auVar81[0xb] = -(cVar93 == pcVar6[0xb]);
              auVar81[0xc] = -(cVar61 == pcVar6[0xc]);
              auVar81[0xd] = -(cVar89 == pcVar6[0xd]);
              auVar81[0xe] = -(cVar91 == pcVar6[0xe]);
              auVar81[0xf] = -(cVar93 == pcVar6[0xf]);
              uVar16 = (ushort)(SUB161(auVar81 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar81 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar81 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar81 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar81 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar81 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar81 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar81 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar81 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar81 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar81 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar81 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar81 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar81 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar81 >> 0x77,0) & 1) << 0xe |
                       (ushort)(auVar81[0xf] >> 7) << 0xf;
              uVar30 = (uint)uVar16;
              if ((bVar8 & 0xf) != 0) {
                uVar30 = (uint)uVar16 << (0x10 - (bVar8 & 0xf) & 0x1f) & 0xfffe |
                         (uint)(uVar16 >> (bVar8 & 0xf));
              }
              if (uVar30 == 0) {
                uVar46 = 0;
              }
              else {
                uVar46 = 0;
                while( true ) {
                  iVar20 = iVar20 + -1;
                  iVar43 = 0;
                  if (uVar30 != 0) {
                    for (; (uVar30 >> iVar43 & 1) == 0; iVar43 = iVar43 + 1) {
                    }
                  }
                  if (pUVar12[uVar24 + (iVar43 + (uint)bVar8 & 0xf)] < uVar21) break;
                  auStack_b8[uVar46] = pUVar12[uVar24 + (iVar43 + (uint)bVar8 & 0xf)];
                  uVar46 = uVar46 + 1;
                  uVar30 = uVar30 & uVar30 - 1;
                  if ((uVar30 == 0) || (iVar20 == 0)) break;
                }
              }
              uVar30 = bVar8 - 1 & 0xf;
              *(char *)(pUVar13 + uVar24) = (char)uVar30;
              *(undefined1 *)((long)(pUVar13 + uVar24) + (ulong)uVar30 + 1) = auVar80[0];
              UVar48 = ms->nextToUpdate;
              ms->nextToUpdate = UVar48 + 1;
              pUVar12[uVar24 + uVar30] = UVar48;
              if (uVar46 == 0) goto LAB_006f363e;
              uVar24 = 999999999;
              uVar50 = 0;
              pBVar37 = (BYTE *)0x3;
              do {
                uVar30 = auStack_b8[uVar50];
                if (uVar30 < uVar47) {
                  if (*(int *)(pBVar49 + uVar30) == *(int *)puVar40) {
                    sVar23 = ZSTD_count_2segments
                                       ((BYTE *)((long)puVar35 + 6),pBVar49 + (ulong)uVar30 + 4,
                                        (BYTE *)iEnd,pBVar49 + uVar47,pBVar33 + uVar47);
                    pBVar27 = (BYTE *)(sVar23 + 4);
                  }
                  else {
LAB_006f2e63:
                    pBVar27 = (BYTE *)0x0;
                  }
                }
                else {
                  puVar32 = (ulong *)(pBVar33 + uVar30);
                  if (pBVar37[(long)puVar32] != *(BYTE *)((long)puVar40 + (long)pBVar37))
                  goto LAB_006f2e63;
                  puVar36 = puVar40;
                  if (puVar40 < puVar1) {
                    uVar28 = *puVar40 ^ *puVar32;
                    uVar26 = 0;
                    if (uVar28 != 0) {
                      for (; (uVar28 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                      }
                    }
                    pBVar27 = (BYTE *)(uVar26 >> 3 & 0x1fffffff);
                    puVar36 = (ulong *)((long)puVar35 + 10);
                    if (*puVar32 == *puVar40) {
                      do {
                        puVar32 = puVar32 + 1;
                        if (puVar1 <= puVar36) goto LAB_006f2e70;
                        uVar26 = *puVar36;
                        uVar44 = uVar26 ^ *puVar32;
                        uVar28 = 0;
                        if (uVar44 != 0) {
                          for (; (uVar44 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                          }
                        }
                        pBVar27 = (BYTE *)((long)puVar36 +
                                          ((uVar28 >> 3 & 0x1fffffff) - (long)puVar40));
                        puVar36 = puVar36 + 1;
                      } while (*puVar32 == uVar26);
                    }
                  }
                  else {
LAB_006f2e70:
                    if ((puVar36 < puVar2) && ((int)*puVar32 == (int)*puVar36)) {
                      puVar36 = (ulong *)((long)puVar36 + 4);
                      puVar32 = (ulong *)((long)puVar32 + 4);
                    }
                    if ((puVar36 < puVar3) && ((short)*puVar32 == (short)*puVar36)) {
                      puVar36 = (ulong *)((long)puVar36 + 2);
                      puVar32 = (ulong *)((long)puVar32 + 2);
                    }
                    if (puVar36 < iEnd) {
                      puVar36 = (ulong *)((long)puVar36 + (ulong)((BYTE)*puVar32 == (BYTE)*puVar36))
                      ;
                    }
                    pBVar27 = (BYTE *)((long)puVar36 - (long)puVar40);
                  }
                }
                pBVar25 = pBVar37;
                if (pBVar37 < pBVar27) {
                  pBVar25 = pBVar27;
                  uVar24 = (ulong)((uVar45 + 2) - uVar30);
                }
              } while ((pBVar27 <= pBVar37 || (ulong *)((long)puVar40 + (long)pBVar27) != iEnd) &&
                      (uVar50 = uVar50 + 1, pBVar37 = pBVar25, uVar50 < uVar46));
            }
            else if (uVar30 == 5) {
              pUVar12 = ms->hashTable;
              pUVar13 = ms->tagTable;
              pBVar33 = (ms->window).base;
              uVar24 = (long)puVar40 - (long)pBVar33;
              uVar34 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
              uVar30 = (ms->window).lowLimit;
              uVar45 = (uint)uVar24;
              uVar21 = uVar45 - uVar34;
              if (uVar45 - uVar30 <= uVar34) {
                uVar21 = uVar30;
              }
              if (ms->loadedDictEnd != 0) {
                uVar21 = uVar30;
              }
              if (3 < uVar47) {
                uVar47 = 4;
              }
              iVar20 = 1 << ((byte)uVar47 & 0x1f);
              pBVar49 = (ms->window).dictBase;
              uVar47 = (ms->window).dictLimit;
              uVar46 = (ulong)ms->nextToUpdate;
              local_198 = (char)ms->rowHashLog;
              if (ms->nextToUpdate < uVar45) {
                do {
                  uVar34 = (uint)uVar46 & 7;
                  uVar30 = ms->hashCache[uVar34];
                  ms->hashCache[uVar34] =
                       (U32)((ulong)(*(long *)(pBVar33 + uVar46 + 8) * -0x30e4432345000000) >>
                            (0x38U - local_198 & 0x3f));
                  uVar50 = (ulong)(uVar30 >> 4 & 0xfffffff0);
                  uVar34 = (byte)((char)pUVar13[uVar50] - 1) & 0xf;
                  *(char *)(pUVar13 + uVar50) = (char)uVar34;
                  *(char *)((long)pUVar13 + (ulong)uVar34 + 1 + uVar50 * 2) = (char)uVar30;
                  pUVar12[uVar50 + uVar34] = (uint)uVar46;
                  uVar46 = uVar46 + 1;
                } while (uVar46 < (uVar24 & 0xffffffff));
              }
              ms->nextToUpdate = uVar45;
              uVar30 = ms->hashCache[uVar45 & 7];
              ms->hashCache[uVar45 & 7] =
                   (U32)((ulong)(*(long *)(pBVar33 + (uVar24 & 0xffffffff) + 8) *
                                -0x30e4432345000000) >> (0x38U - local_198 & 0x3f));
              uVar24 = (ulong)(uVar30 >> 4 & 0xfffffff0);
              bVar8 = (byte)pUVar13[uVar24];
              pcVar6 = (char *)((long)pUVar13 + uVar24 * 2 + 1);
              uVar92 = (undefined1)(uVar30 >> 0x18);
              uVar90 = (undefined1)(uVar30 >> 0x10);
              uVar88 = (undefined1)(uVar30 >> 8);
              auVar83._4_4_ =
                   (int)(CONCAT35(CONCAT21(CONCAT11(uVar92,uVar92),uVar90),CONCAT14(uVar90,uVar30))
                        >> 0x20);
              auVar83[3] = uVar88;
              auVar83[2] = uVar88;
              auVar83[0] = (undefined1)uVar30;
              auVar83[1] = auVar83[0];
              auVar83._8_8_ = 0;
              auVar95 = pshuflw(auVar83,auVar83,0);
              cVar61 = auVar95[0];
              auVar84[0] = -(cVar61 == *pcVar6);
              cVar89 = auVar95[1];
              auVar84[1] = -(cVar89 == pcVar6[1]);
              cVar91 = auVar95[2];
              auVar84[2] = -(cVar91 == pcVar6[2]);
              cVar93 = auVar95[3];
              auVar84[3] = -(cVar93 == pcVar6[3]);
              auVar84[4] = -(cVar61 == pcVar6[4]);
              auVar84[5] = -(cVar89 == pcVar6[5]);
              auVar84[6] = -(cVar91 == pcVar6[6]);
              auVar84[7] = -(cVar93 == pcVar6[7]);
              auVar84[8] = -(cVar61 == pcVar6[8]);
              auVar84[9] = -(cVar89 == pcVar6[9]);
              auVar84[10] = -(cVar91 == pcVar6[10]);
              auVar84[0xb] = -(cVar93 == pcVar6[0xb]);
              auVar84[0xc] = -(cVar61 == pcVar6[0xc]);
              auVar84[0xd] = -(cVar89 == pcVar6[0xd]);
              auVar84[0xe] = -(cVar91 == pcVar6[0xe]);
              auVar84[0xf] = -(cVar93 == pcVar6[0xf]);
              uVar16 = (ushort)(SUB161(auVar84 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar84 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar84 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar84 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar84 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar84 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar84 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar84 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar84 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar84 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar84 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar84 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar84 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar84 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar84 >> 0x77,0) & 1) << 0xe |
                       (ushort)(auVar84[0xf] >> 7) << 0xf;
              uVar30 = (uint)uVar16;
              if ((bVar8 & 0xf) != 0) {
                uVar30 = (uint)uVar16 << (0x10 - (bVar8 & 0xf) & 0x1f) & 0xfffe |
                         (uint)(uVar16 >> (bVar8 & 0xf));
              }
              if (uVar30 == 0) {
                uVar46 = 0;
              }
              else {
                uVar46 = 0;
                while( true ) {
                  iVar20 = iVar20 + -1;
                  iVar43 = 0;
                  if (uVar30 != 0) {
                    for (; (uVar30 >> iVar43 & 1) == 0; iVar43 = iVar43 + 1) {
                    }
                  }
                  if (pUVar12[uVar24 + (iVar43 + (uint)bVar8 & 0xf)] < uVar21) break;
                  auStack_b8[uVar46] = pUVar12[uVar24 + (iVar43 + (uint)bVar8 & 0xf)];
                  uVar46 = uVar46 + 1;
                  uVar30 = uVar30 & uVar30 - 1;
                  if ((uVar30 == 0) || (iVar20 == 0)) break;
                }
              }
              uVar30 = bVar8 - 1 & 0xf;
              *(char *)(pUVar13 + uVar24) = (char)uVar30;
              *(undefined1 *)((long)(pUVar13 + uVar24) + (ulong)uVar30 + 1) = auVar83[0];
              UVar48 = ms->nextToUpdate;
              ms->nextToUpdate = UVar48 + 1;
              pUVar12[uVar24 + uVar30] = UVar48;
              if (uVar46 == 0) goto LAB_006f363e;
              uVar24 = 999999999;
              uVar50 = 0;
              pBVar37 = (BYTE *)0x3;
              do {
                uVar30 = auStack_b8[uVar50];
                if (uVar30 < uVar47) {
                  if (*(int *)(pBVar49 + uVar30) == *(int *)puVar40) {
                    sVar23 = ZSTD_count_2segments
                                       ((BYTE *)((long)puVar35 + 6),pBVar49 + (ulong)uVar30 + 4,
                                        (BYTE *)iEnd,pBVar49 + uVar47,pBVar33 + uVar47);
                    pBVar27 = (BYTE *)(sVar23 + 4);
                  }
                  else {
LAB_006f3215:
                    pBVar27 = (BYTE *)0x0;
                  }
                }
                else {
                  puVar32 = (ulong *)(pBVar33 + uVar30);
                  if (pBVar37[(long)puVar32] != *(BYTE *)((long)puVar40 + (long)pBVar37))
                  goto LAB_006f3215;
                  puVar36 = puVar40;
                  if (puVar40 < puVar1) {
                    uVar28 = *puVar40 ^ *puVar32;
                    uVar26 = 0;
                    if (uVar28 != 0) {
                      for (; (uVar28 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                      }
                    }
                    pBVar27 = (BYTE *)(uVar26 >> 3 & 0x1fffffff);
                    puVar36 = (ulong *)((long)puVar35 + 10);
                    if (*puVar32 == *puVar40) {
                      do {
                        puVar32 = puVar32 + 1;
                        if (puVar1 <= puVar36) goto LAB_006f3222;
                        uVar26 = *puVar36;
                        uVar44 = uVar26 ^ *puVar32;
                        uVar28 = 0;
                        if (uVar44 != 0) {
                          for (; (uVar44 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                          }
                        }
                        pBVar27 = (BYTE *)((long)puVar36 +
                                          ((uVar28 >> 3 & 0x1fffffff) - (long)puVar40));
                        puVar36 = puVar36 + 1;
                      } while (*puVar32 == uVar26);
                    }
                  }
                  else {
LAB_006f3222:
                    if ((puVar36 < puVar2) && ((int)*puVar32 == (int)*puVar36)) {
                      puVar36 = (ulong *)((long)puVar36 + 4);
                      puVar32 = (ulong *)((long)puVar32 + 4);
                    }
                    if ((puVar36 < puVar3) && ((short)*puVar32 == (short)*puVar36)) {
                      puVar36 = (ulong *)((long)puVar36 + 2);
                      puVar32 = (ulong *)((long)puVar32 + 2);
                    }
                    if (puVar36 < iEnd) {
                      puVar36 = (ulong *)((long)puVar36 + (ulong)((BYTE)*puVar32 == (BYTE)*puVar36))
                      ;
                    }
                    pBVar27 = (BYTE *)((long)puVar36 - (long)puVar40);
                  }
                }
                pBVar25 = pBVar37;
                if (pBVar37 < pBVar27) {
                  pBVar25 = pBVar27;
                  uVar24 = (ulong)((uVar45 + 2) - uVar30);
                }
              } while ((pBVar27 <= pBVar37 || (ulong *)((long)puVar40 + (long)pBVar27) != iEnd) &&
                      (uVar50 = uVar50 + 1, pBVar37 = pBVar25, uVar50 < uVar46));
            }
            else {
              pUVar12 = ms->hashTable;
              pUVar13 = ms->tagTable;
              pBVar33 = (ms->window).base;
              uVar24 = (long)puVar40 - (long)pBVar33;
              uVar34 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
              uVar30 = (ms->window).lowLimit;
              uVar45 = (uint)uVar24;
              uVar21 = uVar45 - uVar34;
              if (uVar45 - uVar30 <= uVar34) {
                uVar21 = uVar30;
              }
              if (ms->loadedDictEnd != 0) {
                uVar21 = uVar30;
              }
              if (3 < uVar47) {
                uVar47 = 4;
              }
              iVar20 = 1 << ((byte)uVar47 & 0x1f);
              pBVar49 = (ms->window).dictBase;
              uVar47 = (ms->window).dictLimit;
              uVar46 = (ulong)ms->nextToUpdate;
              local_198 = (char)ms->rowHashLog;
              if (ms->nextToUpdate < uVar45) {
                do {
                  uVar34 = (uint)uVar46 & 7;
                  uVar30 = ms->hashCache[uVar34];
                  ms->hashCache[uVar34] =
                       (uint)(*(int *)(pBVar33 + uVar46 + 8) * -0x61c8864f) >>
                       (0x18U - local_198 & 0x1f);
                  uVar50 = (ulong)(uVar30 >> 4 & 0xfffffff0);
                  uVar34 = (byte)((char)pUVar13[uVar50] - 1) & 0xf;
                  *(char *)(pUVar13 + uVar50) = (char)uVar34;
                  *(char *)((long)pUVar13 + (ulong)uVar34 + 1 + uVar50 * 2) = (char)uVar30;
                  pUVar12[uVar50 + uVar34] = (uint)uVar46;
                  uVar46 = uVar46 + 1;
                } while (uVar46 < (uVar24 & 0xffffffff));
              }
              ms->nextToUpdate = uVar45;
              uVar30 = ms->hashCache[uVar45 & 7];
              ms->hashCache[uVar45 & 7] =
                   (uint)(*(int *)(pBVar33 + (uVar24 & 0xffffffff) + 8) * -0x61c8864f) >>
                   (0x18U - local_198 & 0x1f);
              uVar24 = (ulong)(uVar30 >> 4 & 0xfffffff0);
              bVar8 = (byte)pUVar13[uVar24];
              pcVar6 = (char *)((long)pUVar13 + uVar24 * 2 + 1);
              uVar92 = (undefined1)(uVar30 >> 0x18);
              uVar90 = (undefined1)(uVar30 >> 0x10);
              uVar88 = (undefined1)(uVar30 >> 8);
              auVar86._4_4_ =
                   (int)(CONCAT35(CONCAT21(CONCAT11(uVar92,uVar92),uVar90),CONCAT14(uVar90,uVar30))
                        >> 0x20);
              auVar86[3] = uVar88;
              auVar86[2] = uVar88;
              auVar86[0] = (undefined1)uVar30;
              auVar86[1] = auVar86[0];
              auVar86._8_8_ = 0;
              auVar95 = pshuflw(auVar86,auVar86,0);
              cVar61 = auVar95[0];
              auVar87[0] = -(cVar61 == *pcVar6);
              cVar89 = auVar95[1];
              auVar87[1] = -(cVar89 == pcVar6[1]);
              cVar91 = auVar95[2];
              auVar87[2] = -(cVar91 == pcVar6[2]);
              cVar93 = auVar95[3];
              auVar87[3] = -(cVar93 == pcVar6[3]);
              auVar87[4] = -(cVar61 == pcVar6[4]);
              auVar87[5] = -(cVar89 == pcVar6[5]);
              auVar87[6] = -(cVar91 == pcVar6[6]);
              auVar87[7] = -(cVar93 == pcVar6[7]);
              auVar87[8] = -(cVar61 == pcVar6[8]);
              auVar87[9] = -(cVar89 == pcVar6[9]);
              auVar87[10] = -(cVar91 == pcVar6[10]);
              auVar87[0xb] = -(cVar93 == pcVar6[0xb]);
              auVar87[0xc] = -(cVar61 == pcVar6[0xc]);
              auVar87[0xd] = -(cVar89 == pcVar6[0xd]);
              auVar87[0xe] = -(cVar91 == pcVar6[0xe]);
              auVar87[0xf] = -(cVar93 == pcVar6[0xf]);
              uVar16 = (ushort)(SUB161(auVar87 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar87 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar87 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar87 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar87 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar87 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar87 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar87 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar87 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar87 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar87 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar87 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar87 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar87 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar87 >> 0x77,0) & 1) << 0xe |
                       (ushort)(auVar87[0xf] >> 7) << 0xf;
              uVar30 = (uint)uVar16;
              if ((bVar8 & 0xf) != 0) {
                uVar30 = (uint)uVar16 << (0x10 - (bVar8 & 0xf) & 0x1f) & 0xfffe |
                         (uint)(uVar16 >> (bVar8 & 0xf));
              }
              if (uVar30 == 0) {
                uVar46 = 0;
              }
              else {
                uVar46 = 0;
                while( true ) {
                  iVar20 = iVar20 + -1;
                  iVar43 = 0;
                  if (uVar30 != 0) {
                    for (; (uVar30 >> iVar43 & 1) == 0; iVar43 = iVar43 + 1) {
                    }
                  }
                  if (pUVar12[uVar24 + (iVar43 + (uint)bVar8 & 0xf)] < uVar21) break;
                  auStack_b8[uVar46] = pUVar12[uVar24 + (iVar43 + (uint)bVar8 & 0xf)];
                  uVar46 = uVar46 + 1;
                  uVar30 = uVar30 & uVar30 - 1;
                  if ((uVar30 == 0) || (iVar20 == 0)) break;
                }
              }
              uVar30 = bVar8 - 1 & 0xf;
              *(char *)(pUVar13 + uVar24) = (char)uVar30;
              *(undefined1 *)((long)(pUVar13 + uVar24) + (ulong)uVar30 + 1) = auVar86[0];
              UVar48 = ms->nextToUpdate;
              ms->nextToUpdate = UVar48 + 1;
              pUVar12[uVar24 + uVar30] = UVar48;
              if (uVar46 == 0) goto LAB_006f363e;
              uVar24 = 999999999;
              uVar50 = 0;
              pBVar37 = (BYTE *)0x3;
              do {
                uVar30 = auStack_b8[uVar50];
                if (uVar30 < uVar47) {
                  if (*(int *)(pBVar49 + uVar30) == *(int *)puVar40) {
                    sVar23 = ZSTD_count_2segments
                                       ((BYTE *)((long)puVar35 + 6),pBVar49 + (ulong)uVar30 + 4,
                                        (BYTE *)iEnd,pBVar49 + uVar47,pBVar33 + uVar47);
                    pBVar27 = (BYTE *)(sVar23 + 4);
                  }
                  else {
LAB_006f35ba:
                    pBVar27 = (BYTE *)0x0;
                  }
                }
                else {
                  puVar32 = (ulong *)(pBVar33 + uVar30);
                  if (pBVar37[(long)puVar32] != *(BYTE *)((long)puVar40 + (long)pBVar37))
                  goto LAB_006f35ba;
                  puVar36 = puVar40;
                  if (puVar40 < puVar1) {
                    uVar28 = *puVar40 ^ *puVar32;
                    uVar26 = 0;
                    if (uVar28 != 0) {
                      for (; (uVar28 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                      }
                    }
                    pBVar27 = (BYTE *)(uVar26 >> 3 & 0x1fffffff);
                    puVar36 = (ulong *)((long)puVar35 + 10);
                    if (*puVar32 == *puVar40) {
                      do {
                        puVar32 = puVar32 + 1;
                        if (puVar1 <= puVar36) goto LAB_006f35c7;
                        uVar26 = *puVar36;
                        uVar44 = uVar26 ^ *puVar32;
                        uVar28 = 0;
                        if (uVar44 != 0) {
                          for (; (uVar44 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                          }
                        }
                        pBVar27 = (BYTE *)((long)puVar36 +
                                          ((uVar28 >> 3 & 0x1fffffff) - (long)puVar40));
                        puVar36 = puVar36 + 1;
                      } while (*puVar32 == uVar26);
                    }
                  }
                  else {
LAB_006f35c7:
                    if ((puVar36 < puVar2) && ((int)*puVar32 == (int)*puVar36)) {
                      puVar36 = (ulong *)((long)puVar36 + 4);
                      puVar32 = (ulong *)((long)puVar32 + 4);
                    }
                    if ((puVar36 < puVar3) && ((short)*puVar32 == (short)*puVar36)) {
                      puVar36 = (ulong *)((long)puVar36 + 2);
                      puVar32 = (ulong *)((long)puVar32 + 2);
                    }
                    if (puVar36 < iEnd) {
                      puVar36 = (ulong *)((long)puVar36 + (ulong)((BYTE)*puVar32 == (BYTE)*puVar36))
                      ;
                    }
                    pBVar27 = (BYTE *)((long)puVar36 - (long)puVar40);
                  }
                }
                pBVar25 = pBVar37;
                if (pBVar37 < pBVar27) {
                  pBVar25 = pBVar27;
                  uVar24 = (ulong)((uVar45 + 2) - uVar30);
                }
              } while ((pBVar27 <= pBVar37 || (ulong *)((long)puVar40 + (long)pBVar27) != iEnd) &&
                      (uVar50 = uVar50 + 1, pBVar37 = pBVar25, uVar50 < uVar46));
            }
          }
          else if (uVar30 - 6 < 2) {
            pUVar12 = ms->hashTable;
            pUVar13 = ms->tagTable;
            pBVar33 = (ms->window).base;
            uVar24 = (long)puVar40 - (long)pBVar33;
            uVar45 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
            uVar47 = (ms->window).lowLimit;
            uVar21 = (uint)uVar24;
            uVar30 = uVar21 - uVar45;
            if (uVar21 - uVar47 <= uVar45) {
              uVar30 = uVar47;
            }
            pBVar49 = (ms->window).dictBase;
            uVar45 = (ms->window).dictLimit;
            if (ms->loadedDictEnd != 0) {
              uVar30 = uVar47;
            }
            uVar46 = (ulong)ms->nextToUpdate;
            local_198 = (char)ms->rowHashLog;
            if (ms->nextToUpdate < uVar21) {
              do {
                uVar34 = (uint)uVar46 & 7;
                uVar47 = ms->hashCache[uVar34];
                ms->hashCache[uVar34] =
                     (U32)((ulong)(*(long *)(pBVar33 + uVar46 + 8) * -0x30e4432340650000) >>
                          (0x38U - local_198 & 0x3f));
                uVar50 = (ulong)(uVar47 >> 3 & 0xffffffe0);
                uVar34 = (byte)((char)pUVar13[uVar50] - 1) & 0x1f;
                *(char *)(pUVar13 + uVar50) = (char)uVar34;
                *(char *)((long)pUVar13 + (ulong)uVar34 + 1 + uVar50 * 2) = (char)uVar47;
                pUVar12[uVar50 + uVar34] = (uint)uVar46;
                uVar46 = uVar46 + 1;
              } while (uVar46 < (uVar24 & 0xffffffff));
            }
            ms->nextToUpdate = uVar21;
            uVar47 = ms->hashCache[uVar21 & 7];
            ms->hashCache[uVar21 & 7] =
                 (U32)((ulong)(*(long *)(pBVar33 + (uVar24 & 0xffffffff) + 8) * -0x30e4432340650000)
                      >> (0x38U - local_198 & 0x3f));
            uVar24 = (ulong)(uVar47 >> 3 & 0xffffffe0);
            bVar8 = (byte)pUVar13[uVar24];
            pcVar6 = (char *)((long)pUVar13 + uVar24 * 2 + 1);
            pcVar7 = (char *)((long)pUVar13 + uVar24 * 2 + 0x11);
            uVar92 = (undefined1)(uVar47 >> 0x18);
            uVar90 = (undefined1)(uVar47 >> 0x10);
            uVar88 = (undefined1)(uVar47 >> 8);
            auVar101._4_4_ =
                 (int)(CONCAT35(CONCAT21(CONCAT11(uVar92,uVar92),uVar90),CONCAT14(uVar90,uVar47)) >>
                      0x20);
            auVar101[3] = uVar88;
            auVar101[2] = uVar88;
            auVar101[0] = (undefined1)uVar47;
            auVar101[1] = auVar101[0];
            auVar101._8_8_ = 0;
            auVar95 = pshuflw(auVar101,auVar101,0);
            cVar61 = auVar95[0];
            auVar58[0] = -(*pcVar6 == cVar61);
            cVar89 = auVar95[1];
            auVar58[1] = -(pcVar6[1] == cVar89);
            cVar91 = auVar95[2];
            auVar58[2] = -(pcVar6[2] == cVar91);
            cVar93 = auVar95[3];
            auVar58[3] = -(pcVar6[3] == cVar93);
            auVar58[4] = -(pcVar6[4] == cVar61);
            auVar58[5] = -(pcVar6[5] == cVar89);
            auVar58[6] = -(pcVar6[6] == cVar91);
            auVar58[7] = -(pcVar6[7] == cVar93);
            auVar58[8] = -(pcVar6[8] == cVar61);
            auVar58[9] = -(pcVar6[9] == cVar89);
            auVar58[10] = -(pcVar6[10] == cVar91);
            auVar58[0xb] = -(pcVar6[0xb] == cVar93);
            auVar58[0xc] = -(pcVar6[0xc] == cVar61);
            auVar58[0xd] = -(pcVar6[0xd] == cVar89);
            auVar58[0xe] = -(pcVar6[0xe] == cVar91);
            auVar58[0xf] = -(pcVar6[0xf] == cVar93);
            auVar79[0] = -(*pcVar7 == cVar61);
            auVar79[1] = -(pcVar7[1] == cVar89);
            auVar79[2] = -(pcVar7[2] == cVar91);
            auVar79[3] = -(pcVar7[3] == cVar93);
            auVar79[4] = -(pcVar7[4] == cVar61);
            auVar79[5] = -(pcVar7[5] == cVar89);
            auVar79[6] = -(pcVar7[6] == cVar91);
            auVar79[7] = -(pcVar7[7] == cVar93);
            auVar79[8] = -(pcVar7[8] == cVar61);
            auVar79[9] = -(pcVar7[9] == cVar89);
            auVar79[10] = -(pcVar7[10] == cVar91);
            auVar79[0xb] = -(pcVar7[0xb] == cVar93);
            auVar79[0xc] = -(pcVar7[0xc] == cVar61);
            auVar79[0xd] = -(pcVar7[0xd] == cVar89);
            auVar79[0xe] = -(pcVar7[0xe] == cVar91);
            auVar79[0xf] = -(pcVar7[0xf] == cVar93);
            uVar34 = CONCAT22((ushort)(SUB161(auVar79 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar79 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar79 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar79 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar79 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar79 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar79 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar79 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar79 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar79 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar79 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar79 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar79 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar79 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar79 >> 0x77,0) & 1) << 0xe |
                              (ushort)(auVar79[0xf] >> 7) << 0xf,
                              (ushort)(SUB161(auVar58 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar58 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar58 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar58 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar58 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar58 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar58 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar58 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar58 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar58 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar58 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar58 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar58 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar58 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar58 >> 0x77,0) & 1) << 0xe |
                              (ushort)(auVar58[0xf] >> 7) << 0xf);
            uVar47 = uVar34 >> (bVar8 & 0x1f) | uVar34 << 0x20 - (bVar8 & 0x1f);
            if ((bVar8 & 0x1f) == 0) {
              uVar47 = uVar34;
            }
            if (uVar47 == 0) {
              uVar46 = 0;
            }
            else {
              uVar46 = 0;
              iVar20 = -0x1f;
              while( true ) {
                iVar43 = 0;
                if (uVar47 != 0) {
                  for (; (uVar47 >> iVar43 & 1) == 0; iVar43 = iVar43 + 1) {
                  }
                }
                if (pUVar12[uVar24 + (iVar43 + (uint)bVar8 & 0x1f)] < uVar30) break;
                auStack_b8[uVar46] = pUVar12[uVar24 + (iVar43 + (uint)bVar8 & 0x1f)];
                uVar46 = uVar46 + 1;
                uVar47 = uVar47 & uVar47 - 1;
                if ((uVar47 == 0) || (bVar51 = iVar20 == 0, iVar20 = iVar20 + 1, bVar51)) break;
              }
            }
            uVar47 = bVar8 - 1 & 0x1f;
            *(char *)(pUVar13 + uVar24) = (char)uVar47;
            *(undefined1 *)((long)(pUVar13 + uVar24) + (ulong)uVar47 + 1) = auVar101[0];
            UVar48 = ms->nextToUpdate;
            ms->nextToUpdate = UVar48 + 1;
            pUVar12[uVar24 + uVar47] = UVar48;
            if (uVar46 == 0) goto LAB_006f363e;
            uVar24 = 999999999;
            uVar50 = 0;
            pBVar37 = (BYTE *)0x3;
            do {
              uVar47 = auStack_b8[uVar50];
              if (uVar47 < uVar45) {
                if (*(int *)(pBVar49 + uVar47) == *(int *)puVar40) {
                  sVar23 = ZSTD_count_2segments
                                     ((BYTE *)((long)puVar35 + 6),pBVar49 + (ulong)uVar47 + 4,
                                      (BYTE *)iEnd,pBVar49 + uVar45,pBVar33 + uVar45);
                  pBVar27 = (BYTE *)(sVar23 + 4);
                }
                else {
LAB_006f2c8e:
                  pBVar27 = (BYTE *)0x0;
                }
              }
              else {
                puVar32 = (ulong *)(pBVar33 + uVar47);
                if (pBVar37[(long)puVar32] != *(BYTE *)((long)puVar40 + (long)pBVar37))
                goto LAB_006f2c8e;
                puVar36 = puVar40;
                if (puVar40 < puVar1) {
                  uVar28 = *puVar40 ^ *puVar32;
                  uVar26 = 0;
                  if (uVar28 != 0) {
                    for (; (uVar28 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                    }
                  }
                  pBVar27 = (BYTE *)(uVar26 >> 3 & 0x1fffffff);
                  puVar36 = (ulong *)((long)puVar35 + 10);
                  if (*puVar32 == *puVar40) {
                    do {
                      puVar32 = puVar32 + 1;
                      if (puVar1 <= puVar36) goto LAB_006f2c9b;
                      uVar26 = *puVar36;
                      uVar44 = uVar26 ^ *puVar32;
                      uVar28 = 0;
                      if (uVar44 != 0) {
                        for (; (uVar44 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                        }
                      }
                      pBVar27 = (BYTE *)((long)puVar36 +
                                        ((uVar28 >> 3 & 0x1fffffff) - (long)puVar40));
                      puVar36 = puVar36 + 1;
                    } while (*puVar32 == uVar26);
                  }
                }
                else {
LAB_006f2c9b:
                  if ((puVar36 < puVar2) && ((int)*puVar32 == (int)*puVar36)) {
                    puVar36 = (ulong *)((long)puVar36 + 4);
                    puVar32 = (ulong *)((long)puVar32 + 4);
                  }
                  if ((puVar36 < puVar3) && ((short)*puVar32 == (short)*puVar36)) {
                    puVar36 = (ulong *)((long)puVar36 + 2);
                    puVar32 = (ulong *)((long)puVar32 + 2);
                  }
                  if (puVar36 < iEnd) {
                    puVar36 = (ulong *)((long)puVar36 + (ulong)((BYTE)*puVar32 == (BYTE)*puVar36));
                  }
                  pBVar27 = (BYTE *)((long)puVar36 - (long)puVar40);
                }
              }
              pBVar25 = pBVar37;
              if (pBVar37 < pBVar27) {
                pBVar25 = pBVar27;
                uVar24 = (ulong)((uVar21 + 2) - uVar47);
              }
            } while ((pBVar27 <= pBVar37 || (ulong *)((long)puVar40 + (long)pBVar27) != iEnd) &&
                    (uVar50 = uVar50 + 1, pBVar37 = pBVar25, uVar50 < uVar46));
          }
          else if (uVar30 == 5) {
            pUVar12 = ms->hashTable;
            pUVar13 = ms->tagTable;
            pBVar33 = (ms->window).base;
            uVar24 = (long)puVar40 - (long)pBVar33;
            uVar45 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
            uVar47 = (ms->window).lowLimit;
            uVar21 = (uint)uVar24;
            uVar30 = uVar21 - uVar45;
            if (uVar21 - uVar47 <= uVar45) {
              uVar30 = uVar47;
            }
            pBVar49 = (ms->window).dictBase;
            uVar45 = (ms->window).dictLimit;
            if (ms->loadedDictEnd != 0) {
              uVar30 = uVar47;
            }
            uVar46 = (ulong)ms->nextToUpdate;
            local_198 = (char)ms->rowHashLog;
            if (ms->nextToUpdate < uVar21) {
              do {
                uVar34 = (uint)uVar46 & 7;
                uVar47 = ms->hashCache[uVar34];
                ms->hashCache[uVar34] =
                     (U32)((ulong)(*(long *)(pBVar33 + uVar46 + 8) * -0x30e4432345000000) >>
                          (0x38U - local_198 & 0x3f));
                uVar50 = (ulong)(uVar47 >> 3 & 0xffffffe0);
                uVar34 = (byte)((char)pUVar13[uVar50] - 1) & 0x1f;
                *(char *)(pUVar13 + uVar50) = (char)uVar34;
                *(char *)((long)pUVar13 + (ulong)uVar34 + 1 + uVar50 * 2) = (char)uVar47;
                pUVar12[uVar50 + uVar34] = (uint)uVar46;
                uVar46 = uVar46 + 1;
              } while (uVar46 < (uVar24 & 0xffffffff));
            }
            ms->nextToUpdate = uVar21;
            uVar47 = ms->hashCache[uVar21 & 7];
            ms->hashCache[uVar21 & 7] =
                 (U32)((ulong)(*(long *)(pBVar33 + (uVar24 & 0xffffffff) + 8) * -0x30e4432345000000)
                      >> (0x38U - local_198 & 0x3f));
            uVar24 = (ulong)(uVar47 >> 3 & 0xffffffe0);
            bVar8 = (byte)pUVar13[uVar24];
            pcVar6 = (char *)((long)pUVar13 + uVar24 * 2 + 1);
            pcVar7 = (char *)((long)pUVar13 + uVar24 * 2 + 0x11);
            uVar92 = (undefined1)(uVar47 >> 0x18);
            uVar90 = (undefined1)(uVar47 >> 0x10);
            uVar88 = (undefined1)(uVar47 >> 8);
            auVar102._4_4_ =
                 (int)(CONCAT35(CONCAT21(CONCAT11(uVar92,uVar92),uVar90),CONCAT14(uVar90,uVar47)) >>
                      0x20);
            auVar102[3] = uVar88;
            auVar102[2] = uVar88;
            auVar102[0] = (undefined1)uVar47;
            auVar102[1] = auVar102[0];
            auVar102._8_8_ = 0;
            auVar95 = pshuflw(auVar102,auVar102,0);
            cVar61 = auVar95[0];
            auVar59[0] = -(*pcVar6 == cVar61);
            cVar89 = auVar95[1];
            auVar59[1] = -(pcVar6[1] == cVar89);
            cVar91 = auVar95[2];
            auVar59[2] = -(pcVar6[2] == cVar91);
            cVar93 = auVar95[3];
            auVar59[3] = -(pcVar6[3] == cVar93);
            auVar59[4] = -(pcVar6[4] == cVar61);
            auVar59[5] = -(pcVar6[5] == cVar89);
            auVar59[6] = -(pcVar6[6] == cVar91);
            auVar59[7] = -(pcVar6[7] == cVar93);
            auVar59[8] = -(pcVar6[8] == cVar61);
            auVar59[9] = -(pcVar6[9] == cVar89);
            auVar59[10] = -(pcVar6[10] == cVar91);
            auVar59[0xb] = -(pcVar6[0xb] == cVar93);
            auVar59[0xc] = -(pcVar6[0xc] == cVar61);
            auVar59[0xd] = -(pcVar6[0xd] == cVar89);
            auVar59[0xe] = -(pcVar6[0xe] == cVar91);
            auVar59[0xf] = -(pcVar6[0xf] == cVar93);
            auVar82[0] = -(*pcVar7 == cVar61);
            auVar82[1] = -(pcVar7[1] == cVar89);
            auVar82[2] = -(pcVar7[2] == cVar91);
            auVar82[3] = -(pcVar7[3] == cVar93);
            auVar82[4] = -(pcVar7[4] == cVar61);
            auVar82[5] = -(pcVar7[5] == cVar89);
            auVar82[6] = -(pcVar7[6] == cVar91);
            auVar82[7] = -(pcVar7[7] == cVar93);
            auVar82[8] = -(pcVar7[8] == cVar61);
            auVar82[9] = -(pcVar7[9] == cVar89);
            auVar82[10] = -(pcVar7[10] == cVar91);
            auVar82[0xb] = -(pcVar7[0xb] == cVar93);
            auVar82[0xc] = -(pcVar7[0xc] == cVar61);
            auVar82[0xd] = -(pcVar7[0xd] == cVar89);
            auVar82[0xe] = -(pcVar7[0xe] == cVar91);
            auVar82[0xf] = -(pcVar7[0xf] == cVar93);
            uVar34 = CONCAT22((ushort)(SUB161(auVar82 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar82 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar82 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar82 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar82 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar82 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar82 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar82 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar82 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar82 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar82 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar82 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar82 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar82 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar82 >> 0x77,0) & 1) << 0xe |
                              (ushort)(auVar82[0xf] >> 7) << 0xf,
                              (ushort)(SUB161(auVar59 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar59 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar59 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar59 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar59 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar59 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar59 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar59 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar59 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar59 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar59 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar59 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar59 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar59 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar59 >> 0x77,0) & 1) << 0xe |
                              (ushort)(auVar59[0xf] >> 7) << 0xf);
            uVar47 = uVar34 >> (bVar8 & 0x1f) | uVar34 << 0x20 - (bVar8 & 0x1f);
            if ((bVar8 & 0x1f) == 0) {
              uVar47 = uVar34;
            }
            if (uVar47 == 0) {
              uVar46 = 0;
            }
            else {
              uVar46 = 0;
              iVar20 = -0x1f;
              while( true ) {
                iVar43 = 0;
                if (uVar47 != 0) {
                  for (; (uVar47 >> iVar43 & 1) == 0; iVar43 = iVar43 + 1) {
                  }
                }
                if (pUVar12[uVar24 + (iVar43 + (uint)bVar8 & 0x1f)] < uVar30) break;
                auStack_b8[uVar46] = pUVar12[uVar24 + (iVar43 + (uint)bVar8 & 0x1f)];
                uVar46 = uVar46 + 1;
                uVar47 = uVar47 & uVar47 - 1;
                if ((uVar47 == 0) || (bVar51 = iVar20 == 0, iVar20 = iVar20 + 1, bVar51)) break;
              }
            }
            uVar47 = bVar8 - 1 & 0x1f;
            *(char *)(pUVar13 + uVar24) = (char)uVar47;
            *(undefined1 *)((long)(pUVar13 + uVar24) + (ulong)uVar47 + 1) = auVar102[0];
            UVar48 = ms->nextToUpdate;
            ms->nextToUpdate = UVar48 + 1;
            pUVar12[uVar24 + uVar47] = UVar48;
            if (uVar46 == 0) {
LAB_006f363e:
              pBVar25 = (BYTE *)0x3;
              uVar24 = 999999999;
            }
            else {
              uVar24 = 999999999;
              uVar50 = 0;
              pBVar37 = (BYTE *)0x3;
              do {
                uVar47 = auStack_b8[uVar50];
                if (uVar47 < uVar45) {
                  if (*(int *)(pBVar49 + uVar47) == *(int *)puVar40) {
                    sVar23 = ZSTD_count_2segments
                                       ((BYTE *)((long)puVar35 + 6),pBVar49 + (ulong)uVar47 + 4,
                                        (BYTE *)iEnd,pBVar49 + uVar45,pBVar33 + uVar45);
                    pBVar27 = (BYTE *)(sVar23 + 4);
                  }
                  else {
LAB_006f3040:
                    pBVar27 = (BYTE *)0x0;
                  }
                }
                else {
                  puVar32 = (ulong *)(pBVar33 + uVar47);
                  if (pBVar37[(long)puVar32] != *(BYTE *)((long)puVar40 + (long)pBVar37))
                  goto LAB_006f3040;
                  puVar36 = puVar40;
                  if (puVar40 < puVar1) {
                    uVar28 = *puVar40 ^ *puVar32;
                    uVar26 = 0;
                    if (uVar28 != 0) {
                      for (; (uVar28 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                      }
                    }
                    pBVar27 = (BYTE *)(uVar26 >> 3 & 0x1fffffff);
                    puVar36 = (ulong *)((long)puVar35 + 10);
                    if (*puVar32 == *puVar40) {
                      do {
                        puVar32 = puVar32 + 1;
                        if (puVar1 <= puVar36) goto LAB_006f304d;
                        uVar26 = *puVar36;
                        uVar44 = uVar26 ^ *puVar32;
                        uVar28 = 0;
                        if (uVar44 != 0) {
                          for (; (uVar44 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                          }
                        }
                        pBVar27 = (BYTE *)((long)puVar36 +
                                          ((uVar28 >> 3 & 0x1fffffff) - (long)puVar40));
                        puVar36 = puVar36 + 1;
                      } while (*puVar32 == uVar26);
                    }
                  }
                  else {
LAB_006f304d:
                    if ((puVar36 < puVar2) && ((int)*puVar32 == (int)*puVar36)) {
                      puVar36 = (ulong *)((long)puVar36 + 4);
                      puVar32 = (ulong *)((long)puVar32 + 4);
                    }
                    if ((puVar36 < puVar3) && ((short)*puVar32 == (short)*puVar36)) {
                      puVar36 = (ulong *)((long)puVar36 + 2);
                      puVar32 = (ulong *)((long)puVar32 + 2);
                    }
                    if (puVar36 < iEnd) {
                      puVar36 = (ulong *)((long)puVar36 + (ulong)((BYTE)*puVar32 == (BYTE)*puVar36))
                      ;
                    }
                    pBVar27 = (BYTE *)((long)puVar36 - (long)puVar40);
                  }
                }
                pBVar25 = pBVar37;
                if (pBVar37 < pBVar27) {
                  pBVar25 = pBVar27;
                  uVar24 = (ulong)((uVar21 + 2) - uVar47);
                }
              } while ((pBVar27 <= pBVar37 || (ulong *)((long)puVar40 + (long)pBVar27) != iEnd) &&
                      (uVar50 = uVar50 + 1, pBVar37 = pBVar25, uVar50 < uVar46));
            }
          }
          else {
            pUVar12 = ms->hashTable;
            pUVar13 = ms->tagTable;
            pBVar33 = (ms->window).base;
            uVar24 = (long)puVar40 - (long)pBVar33;
            uVar45 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
            uVar47 = (ms->window).lowLimit;
            uVar21 = (uint)uVar24;
            uVar30 = uVar21 - uVar45;
            if (uVar21 - uVar47 <= uVar45) {
              uVar30 = uVar47;
            }
            pBVar49 = (ms->window).dictBase;
            uVar45 = (ms->window).dictLimit;
            if (ms->loadedDictEnd != 0) {
              uVar30 = uVar47;
            }
            uVar46 = (ulong)ms->nextToUpdate;
            cVar61 = (char)ms->rowHashLog;
            if (ms->nextToUpdate < uVar21) {
              do {
                uVar34 = (uint)uVar46 & 7;
                uVar47 = ms->hashCache[uVar34];
                ms->hashCache[uVar34] =
                     (uint)(*(int *)(pBVar33 + uVar46 + 8) * -0x61c8864f) >> (0x18U - cVar61 & 0x1f)
                ;
                uVar50 = (ulong)(uVar47 >> 3 & 0xffffffe0);
                uVar34 = (byte)((char)pUVar13[uVar50] - 1) & 0x1f;
                *(char *)(pUVar13 + uVar50) = (char)uVar34;
                *(char *)((long)pUVar13 + (ulong)uVar34 + 1 + uVar50 * 2) = (char)uVar47;
                pUVar12[uVar50 + uVar34] = (uint)uVar46;
                uVar46 = uVar46 + 1;
              } while (uVar46 < (uVar24 & 0xffffffff));
            }
            ms->nextToUpdate = uVar21;
            uVar47 = ms->hashCache[uVar21 & 7];
            ms->hashCache[uVar21 & 7] =
                 (uint)(*(int *)(pBVar33 + (uVar24 & 0xffffffff) + 8) * -0x61c8864f) >>
                 (0x18U - cVar61 & 0x1f);
            uVar24 = (ulong)(uVar47 >> 3 & 0xffffffe0);
            bVar8 = (byte)pUVar13[uVar24];
            pcVar6 = (char *)((long)pUVar13 + uVar24 * 2 + 1);
            pcVar7 = (char *)((long)pUVar13 + uVar24 * 2 + 0x11);
            uVar92 = (undefined1)(uVar47 >> 0x18);
            uVar90 = (undefined1)(uVar47 >> 0x10);
            uVar88 = (undefined1)(uVar47 >> 8);
            auVar103._4_4_ =
                 (int)(CONCAT35(CONCAT21(CONCAT11(uVar92,uVar92),uVar90),CONCAT14(uVar90,uVar47)) >>
                      0x20);
            auVar103[3] = uVar88;
            auVar103[2] = uVar88;
            auVar103[0] = (undefined1)uVar47;
            auVar103[1] = auVar103[0];
            auVar103._8_8_ = 0;
            auVar95 = pshuflw(auVar103,auVar103,0);
            cVar61 = auVar95[0];
            auVar60[0] = -(*pcVar6 == cVar61);
            cVar89 = auVar95[1];
            auVar60[1] = -(pcVar6[1] == cVar89);
            cVar91 = auVar95[2];
            auVar60[2] = -(pcVar6[2] == cVar91);
            cVar93 = auVar95[3];
            auVar60[3] = -(pcVar6[3] == cVar93);
            auVar60[4] = -(pcVar6[4] == cVar61);
            auVar60[5] = -(pcVar6[5] == cVar89);
            auVar60[6] = -(pcVar6[6] == cVar91);
            auVar60[7] = -(pcVar6[7] == cVar93);
            auVar60[8] = -(pcVar6[8] == cVar61);
            auVar60[9] = -(pcVar6[9] == cVar89);
            auVar60[10] = -(pcVar6[10] == cVar91);
            auVar60[0xb] = -(pcVar6[0xb] == cVar93);
            auVar60[0xc] = -(pcVar6[0xc] == cVar61);
            auVar60[0xd] = -(pcVar6[0xd] == cVar89);
            auVar60[0xe] = -(pcVar6[0xe] == cVar91);
            auVar60[0xf] = -(pcVar6[0xf] == cVar93);
            auVar85[0] = -(*pcVar7 == cVar61);
            auVar85[1] = -(pcVar7[1] == cVar89);
            auVar85[2] = -(pcVar7[2] == cVar91);
            auVar85[3] = -(pcVar7[3] == cVar93);
            auVar85[4] = -(pcVar7[4] == cVar61);
            auVar85[5] = -(pcVar7[5] == cVar89);
            auVar85[6] = -(pcVar7[6] == cVar91);
            auVar85[7] = -(pcVar7[7] == cVar93);
            auVar85[8] = -(pcVar7[8] == cVar61);
            auVar85[9] = -(pcVar7[9] == cVar89);
            auVar85[10] = -(pcVar7[10] == cVar91);
            auVar85[0xb] = -(pcVar7[0xb] == cVar93);
            auVar85[0xc] = -(pcVar7[0xc] == cVar61);
            auVar85[0xd] = -(pcVar7[0xd] == cVar89);
            auVar85[0xe] = -(pcVar7[0xe] == cVar91);
            auVar85[0xf] = -(pcVar7[0xf] == cVar93);
            uVar34 = CONCAT22((ushort)(SUB161(auVar85 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar85 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar85 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar85 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar85 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar85 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar85 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar85 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar85 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar85 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar85 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar85 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar85 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar85 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar85 >> 0x77,0) & 1) << 0xe |
                              (ushort)(auVar85[0xf] >> 7) << 0xf,
                              (ushort)(SUB161(auVar60 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar60 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar60 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar60 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar60 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar60 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar60 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar60 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar60 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar60 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar60 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar60 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar60 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar60 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar60 >> 0x77,0) & 1) << 0xe |
                              (ushort)(auVar60[0xf] >> 7) << 0xf);
            uVar47 = uVar34 >> (bVar8 & 0x1f) | uVar34 << 0x20 - (bVar8 & 0x1f);
            if ((bVar8 & 0x1f) == 0) {
              uVar47 = uVar34;
            }
            if (uVar47 == 0) {
              uVar46 = 0;
            }
            else {
              uVar46 = 0;
              iVar20 = -0x1f;
              while( true ) {
                iVar43 = 0;
                if (uVar47 != 0) {
                  for (; (uVar47 >> iVar43 & 1) == 0; iVar43 = iVar43 + 1) {
                  }
                }
                if (pUVar12[uVar24 + (iVar43 + (uint)bVar8 & 0x1f)] < uVar30) break;
                auStack_b8[uVar46] = pUVar12[uVar24 + (iVar43 + (uint)bVar8 & 0x1f)];
                uVar46 = uVar46 + 1;
                uVar47 = uVar47 & uVar47 - 1;
                if ((uVar47 == 0) || (bVar51 = iVar20 == 0, iVar20 = iVar20 + 1, bVar51)) break;
              }
            }
            uVar47 = bVar8 - 1 & 0x1f;
            *(char *)(pUVar13 + uVar24) = (char)uVar47;
            *(undefined1 *)((long)(pUVar13 + uVar24) + (ulong)uVar47 + 1) = auVar103[0];
            UVar48 = ms->nextToUpdate;
            ms->nextToUpdate = UVar48 + 1;
            pUVar12[uVar24 + uVar47] = UVar48;
            if (uVar46 == 0) goto LAB_006f363e;
            uVar24 = 999999999;
            uVar50 = 0;
            pBVar37 = (BYTE *)0x3;
            do {
              uVar47 = auStack_b8[uVar50];
              if (uVar47 < uVar45) {
                if (*(int *)(pBVar49 + uVar47) == *(int *)puVar40) {
                  sVar23 = ZSTD_count_2segments
                                     ((BYTE *)((long)puVar35 + 6),pBVar49 + (ulong)uVar47 + 4,
                                      (BYTE *)iEnd,pBVar49 + uVar45,pBVar33 + uVar45);
                  pBVar27 = (BYTE *)(sVar23 + 4);
                }
                else {
LAB_006f33e5:
                  pBVar27 = (BYTE *)0x0;
                }
              }
              else {
                puVar32 = (ulong *)(pBVar33 + uVar47);
                if (pBVar37[(long)puVar32] != *(BYTE *)((long)puVar40 + (long)pBVar37))
                goto LAB_006f33e5;
                puVar36 = puVar40;
                if (puVar40 < puVar1) {
                  uVar28 = *puVar40 ^ *puVar32;
                  uVar26 = 0;
                  if (uVar28 != 0) {
                    for (; (uVar28 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                    }
                  }
                  pBVar27 = (BYTE *)(uVar26 >> 3 & 0x1fffffff);
                  puVar36 = (ulong *)((long)puVar35 + 10);
                  if (*puVar32 == *puVar40) {
                    do {
                      puVar32 = puVar32 + 1;
                      if (puVar1 <= puVar36) goto LAB_006f33f2;
                      uVar26 = *puVar36;
                      uVar44 = uVar26 ^ *puVar32;
                      uVar28 = 0;
                      if (uVar44 != 0) {
                        for (; (uVar44 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                        }
                      }
                      pBVar27 = (BYTE *)((long)puVar36 +
                                        ((uVar28 >> 3 & 0x1fffffff) - (long)puVar40));
                      puVar36 = puVar36 + 1;
                    } while (*puVar32 == uVar26);
                  }
                }
                else {
LAB_006f33f2:
                  if ((puVar36 < puVar2) && ((int)*puVar32 == (int)*puVar36)) {
                    puVar36 = (ulong *)((long)puVar36 + 4);
                    puVar32 = (ulong *)((long)puVar32 + 4);
                  }
                  if ((puVar36 < puVar3) && ((short)*puVar32 == (short)*puVar36)) {
                    puVar36 = (ulong *)((long)puVar36 + 2);
                    puVar32 = (ulong *)((long)puVar32 + 2);
                  }
                  if (puVar36 < iEnd) {
                    puVar36 = (ulong *)((long)puVar36 + (ulong)((BYTE)*puVar32 == (BYTE)*puVar36));
                  }
                  pBVar27 = (BYTE *)((long)puVar36 - (long)puVar40);
                }
              }
              pBVar25 = pBVar37;
              if (pBVar37 < pBVar27) {
                pBVar25 = pBVar27;
                uVar24 = (ulong)((uVar21 + 2) - uVar47);
              }
            } while ((pBVar27 <= pBVar37 || (ulong *)((long)puVar40 + (long)pBVar27) != iEnd) &&
                    (uVar50 = uVar50 + 1, pBVar37 = pBVar25, uVar50 < uVar46));
          }
          bVar51 = true;
          if ((BYTE *)0x3 < pBVar25) {
            uVar30 = (int)local_178 + 1;
            uVar47 = 0x1f;
            if (uVar30 != 0) {
              for (; uVar30 >> uVar47 == 0; uVar47 = uVar47 - 1) {
              }
            }
            uVar30 = (int)uVar24 + 1;
            iVar20 = 0x1f;
            if (uVar30 != 0) {
              for (; uVar30 >> iVar20 == 0; iVar20 = iVar20 + -1) {
              }
            }
            if ((int)((uVar47 ^ 0x1f) + (int)local_160 * 4 + -0x18) < (int)pBVar25 * 4 - iVar20) {
              bVar51 = false;
              puVar31 = puVar40;
              local_178 = uVar24;
              local_160 = pBVar25;
            }
          }
        } while (!bVar51);
LAB_006f36dc:
        if (local_178 == 0) {
          UVar48 = 1;
        }
        else {
          pBVar37 = (BYTE *)((long)puVar31 + (2 - (long)(base_00 + local_178)));
          pBVar49 = iStart;
          pBVar33 = base_00;
          if ((uint)pBVar37 < uVar9) {
            pBVar49 = pBVar11 + uVar10;
            pBVar33 = pBVar11;
          }
          if ((local_110 < puVar31) &&
             (uVar24 = (ulong)pBVar37 & 0xffffffff, pBVar49 < pBVar33 + uVar24)) {
            pBVar33 = pBVar33 + uVar24;
            do {
              pBVar33 = pBVar33 + -1;
              puVar40 = (ulong *)((long)puVar31 + -1);
              if ((*(BYTE *)puVar40 != *pBVar33) ||
                 (local_160 = local_160 + 1, puVar31 = puVar40, puVar40 <= local_110)) break;
            } while (pBVar49 < pBVar33);
          }
          UVar48 = (int)local_178 + 1;
          local_12c = local_144;
          local_144 = (int)local_178 - 2;
        }
        uVar24 = (long)puVar31 - (long)local_110;
        if (puVar4 < puVar31) {
          puVar35 = (ulong *)seqStore->lit;
          puVar40 = puVar35;
          puVar32 = local_110;
          if (local_110 <= puVar4) {
            puVar40 = (ulong *)((long)puVar35 + ((long)puVar4 - (long)local_110));
            uVar46 = local_110[1];
            *puVar35 = *local_110;
            puVar35[1] = uVar46;
            puVar32 = puVar4;
            if (0x10 < (long)puVar4 - (long)local_110) {
              lVar41 = 0x10;
              do {
                uVar17 = *(undefined8 *)((BYTE *)((long)local_110 + lVar41) + 8);
                puVar5 = (undefined8 *)((long)puVar35 + lVar41);
                *puVar5 = *(undefined8 *)((long)local_110 + lVar41);
                puVar5[1] = uVar17;
                pBVar33 = (BYTE *)((long)local_110 + lVar41 + 0x10);
                uVar17 = *(undefined8 *)(pBVar33 + 8);
                puVar5[2] = *(undefined8 *)pBVar33;
                puVar5[3] = uVar17;
                lVar41 = lVar41 + 0x20;
              } while (puVar5 + 4 < puVar40);
            }
          }
          if (puVar32 < puVar31) {
            lVar41 = 0;
            do {
              *(BYTE *)((long)puVar40 + lVar41) = *(BYTE *)((long)puVar32 + lVar41);
              lVar41 = lVar41 + 1;
            } while ((long)puVar31 - (long)puVar32 != lVar41);
          }
        }
        else {
          puVar40 = (ulong *)seqStore->lit;
          uVar46 = local_110[1];
          *puVar40 = *local_110;
          puVar40[1] = uVar46;
          if (0x10 < uVar24) {
            pBVar33 = seqStore->lit;
            uVar46 = local_110[3];
            *(ulong *)(pBVar33 + 0x10) = local_110[2];
            *(ulong *)(pBVar33 + 0x18) = uVar46;
            if (0x20 < (long)uVar24) {
              lVar41 = 0;
              do {
                pBVar37 = (BYTE *)((long)local_110 + lVar41 + 0x20);
                uVar17 = *(undefined8 *)(pBVar37 + 8);
                pBVar49 = pBVar33 + lVar41 + 0x20;
                *(undefined8 *)pBVar49 = *(undefined8 *)pBVar37;
                *(undefined8 *)(pBVar49 + 8) = uVar17;
                pBVar37 = (BYTE *)((long)local_110 + lVar41 + 0x30);
                uVar17 = *(undefined8 *)(pBVar37 + 8);
                *(undefined8 *)(pBVar49 + 0x10) = *(undefined8 *)pBVar37;
                *(undefined8 *)(pBVar49 + 0x18) = uVar17;
                lVar41 = lVar41 + 0x20;
              } while (pBVar49 + 0x20 < pBVar33 + uVar24);
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar24;
        if (0xffff < uVar24) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        psVar14 = seqStore->sequences;
        psVar14->litLength = (U16)uVar24;
        psVar14->offset = UVar48;
        if ((BYTE *)0xffff < local_160 + -3) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar14->matchLength = (U16)(local_160 + -3);
        seqStore->sequences = psVar14 + 1;
        puVar40 = (ulong *)((long)puVar31 + (long)local_160);
        local_110 = puVar40;
        do {
          if (iLimit < puVar40) break;
          iVar39 = (int)puVar40 - (int)base_00;
          UVar48 = (ms->window).lowLimit;
          UVar29 = iVar39 - uVar18;
          if (iVar39 - UVar48 <= uVar18) {
            UVar29 = UVar48;
          }
          if (ms->loadedDictEnd != 0) {
            UVar29 = UVar48;
          }
          uVar47 = iVar39 - local_12c;
          pBVar33 = base_00;
          if (uVar47 < uVar9) {
            pBVar33 = pBVar11;
          }
          if (((iVar19 - uVar47 < 3) || (iVar39 - UVar29 <= local_12c)) ||
             ((int)*puVar40 != *(int *)(pBVar33 + uVar47))) {
            bVar51 = false;
            UVar48 = local_12c;
          }
          else {
            puVar31 = iEnd;
            if (uVar47 < uVar9) {
              puVar31 = puVar22;
            }
            sVar23 = ZSTD_count_2segments
                               ((BYTE *)((long)puVar40 + 4),(BYTE *)((long)(pBVar33 + uVar47) + 4),
                                (BYTE *)iEnd,(BYTE *)puVar31,iStart);
            if (local_110 <= puVar4) {
              puVar31 = (ulong *)seqStore->lit;
              uVar24 = local_110[1];
              *puVar31 = *local_110;
              puVar31[1] = uVar24;
            }
            psVar14 = seqStore->sequences;
            psVar14->litLength = 0;
            psVar14->offset = 1;
            if (0xffff < sVar23 + 1) {
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar14->matchLength = (U16)(sVar23 + 1);
            seqStore->sequences = psVar14 + 1;
            puVar40 = (ulong *)((long)puVar40 + sVar23 + 4);
            bVar51 = true;
            UVar48 = local_144;
            local_144 = local_12c;
            local_110 = puVar40;
          }
          local_12c = UVar48;
        } while (bVar51);
      }
    } while (puVar40 < iLimit);
  }
  *local_38 = local_144;
  local_38[1] = local_12c;
  return (long)iEnd - (long)local_110;
}

Assistant:

size_t ZSTD_compressBlock_lazy2_extDict_row(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)

{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_rowHash, 2);
}